

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [28];
  float *pfVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined1 auVar9 [32];
  Primitive PVar10;
  uint uVar11;
  int iVar12;
  Geometry *pGVar13;
  __int_type_conflict _Var14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  long lVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [28];
  undefined1 auVar80 [28];
  byte bVar81;
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  Geometry *geometry;
  long lVar88;
  ulong uVar89;
  undefined4 uVar90;
  undefined8 uVar91;
  float fVar106;
  vint4 bi_2;
  undefined1 auVar92 [16];
  float fVar104;
  float fVar108;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar105;
  float fVar107;
  float fVar109;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  vint4 bi_1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar116 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  float fVar128;
  float fVar129;
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar139 [32];
  undefined1 auVar133 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  vint4 ai_2;
  undefined1 auVar143 [16];
  float fVar146;
  float fVar147;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 ai;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar158 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar166 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [64];
  vint4 ai_1;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined4 uVar194;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar197;
  float fVar201;
  undefined1 auVar198 [16];
  undefined8 uVar202;
  undefined8 uVar203;
  undefined8 uVar204;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  float fVar207;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar212 [64];
  float fVar219;
  float fVar221;
  undefined1 auVar220 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  bool local_84d;
  undefined1 local_840 [32];
  undefined1 local_800 [32];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 (*local_638) [16];
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 auStack_5f0 [8];
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [8];
  undefined8 uStack_578;
  undefined1 auStack_570 [8];
  float fStack_568;
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined1 auStack_550 [8];
  float fStack_548;
  undefined1 local_540 [32];
  ulong local_510;
  uint uStack_508;
  uint uStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  LinearSpace3fa *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  undefined8 uStack_478;
  undefined1 auStack_470 [8];
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 local_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined1 local_390 [16];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar10 = prim[1];
  uVar89 = (ulong)(byte)PVar10;
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar129 = *(float *)(prim + uVar89 * 0x19 + 0x12);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + uVar89 * 0x19 + 6));
  auVar92._0_4_ = fVar129 * auVar16._0_4_;
  auVar92._4_4_ = fVar129 * auVar16._4_4_;
  auVar92._8_4_ = fVar129 * auVar16._8_4_;
  auVar92._12_4_ = fVar129 * auVar16._12_4_;
  auVar155._0_4_ = fVar129 * auVar17._0_4_;
  auVar155._4_4_ = fVar129 * auVar17._4_4_;
  auVar155._8_4_ = fVar129 * auVar17._8_4_;
  auVar155._12_4_ = fVar129 * auVar17._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 4 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 6 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 * 0xb + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar10 * 0xc) + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar10 * 0xc + uVar89 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar84 = (ulong)(uint)((int)(uVar89 * 9) * 2);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + uVar89 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar84 = (ulong)(uint)((int)(uVar89 * 5) << 2);
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 + 6)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar208._4_4_ = auVar155._0_4_;
  auVar208._0_4_ = auVar155._0_4_;
  auVar208._8_4_ = auVar155._0_4_;
  auVar208._12_4_ = auVar155._0_4_;
  auVar114 = vshufps_avx(auVar155,auVar155,0x55);
  auVar93 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar129 = auVar93._0_4_;
  auVar195._0_4_ = fVar129 * auVar19._0_4_;
  fVar104 = auVar93._4_4_;
  auVar195._4_4_ = fVar104 * auVar19._4_4_;
  fVar106 = auVar93._8_4_;
  auVar195._8_4_ = fVar106 * auVar19._8_4_;
  fVar108 = auVar93._12_4_;
  auVar195._12_4_ = fVar108 * auVar19._12_4_;
  auVar189._0_4_ = auVar22._0_4_ * fVar129;
  auVar189._4_4_ = auVar22._4_4_ * fVar104;
  auVar189._8_4_ = auVar22._8_4_ * fVar106;
  auVar189._12_4_ = auVar22._12_4_ * fVar108;
  auVar178._0_4_ = auVar115._0_4_ * fVar129;
  auVar178._4_4_ = auVar115._4_4_ * fVar104;
  auVar178._8_4_ = auVar115._8_4_ * fVar106;
  auVar178._12_4_ = auVar115._12_4_ * fVar108;
  auVar93 = vfmadd231ps_fma(auVar195,auVar114,auVar17);
  auVar130 = vfmadd231ps_fma(auVar189,auVar114,auVar21);
  auVar114 = vfmadd231ps_fma(auVar178,auVar94,auVar114);
  auVar143 = vfmadd231ps_fma(auVar93,auVar208,auVar16);
  auVar130 = vfmadd231ps_fma(auVar130,auVar208,auVar20);
  auVar149 = vfmadd231ps_fma(auVar114,auVar95,auVar208);
  auVar209._4_4_ = auVar92._0_4_;
  auVar209._0_4_ = auVar92._0_4_;
  auVar209._8_4_ = auVar92._0_4_;
  auVar209._12_4_ = auVar92._0_4_;
  auVar114 = vshufps_avx(auVar92,auVar92,0x55);
  auVar93 = vshufps_avx(auVar92,auVar92,0xaa);
  fVar129 = auVar93._0_4_;
  auVar156._0_4_ = fVar129 * auVar19._0_4_;
  fVar104 = auVar93._4_4_;
  auVar156._4_4_ = fVar104 * auVar19._4_4_;
  fVar106 = auVar93._8_4_;
  auVar156._8_4_ = fVar106 * auVar19._8_4_;
  fVar108 = auVar93._12_4_;
  auVar156._12_4_ = fVar108 * auVar19._12_4_;
  auVar113._0_4_ = auVar22._0_4_ * fVar129;
  auVar113._4_4_ = auVar22._4_4_ * fVar104;
  auVar113._8_4_ = auVar22._8_4_ * fVar106;
  auVar113._12_4_ = auVar22._12_4_ * fVar108;
  auVar93._0_4_ = auVar115._0_4_ * fVar129;
  auVar93._4_4_ = auVar115._4_4_ * fVar104;
  auVar93._8_4_ = auVar115._8_4_ * fVar106;
  auVar93._12_4_ = auVar115._12_4_ * fVar108;
  auVar17 = vfmadd231ps_fma(auVar156,auVar114,auVar17);
  auVar19 = vfmadd231ps_fma(auVar113,auVar114,auVar21);
  auVar21 = vfmadd231ps_fma(auVar93,auVar114,auVar94);
  auVar22 = vfmadd231ps_fma(auVar17,auVar209,auVar16);
  auVar94 = vfmadd231ps_fma(auVar19,auVar209,auVar20);
  auVar115 = vfmadd231ps_fma(auVar21,auVar209,auVar95);
  local_2f0._8_4_ = 0x7fffffff;
  local_2f0._0_8_ = 0x7fffffff7fffffff;
  local_2f0._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar143,local_2f0);
  auVar148._8_4_ = 0x219392ef;
  auVar148._0_8_ = 0x219392ef219392ef;
  auVar148._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar148,1);
  auVar17 = vblendvps_avx(auVar143,auVar148,auVar16);
  auVar16 = vandps_avx(auVar130,local_2f0);
  auVar16 = vcmpps_avx(auVar16,auVar148,1);
  auVar19 = vblendvps_avx(auVar130,auVar148,auVar16);
  auVar16 = vandps_avx(auVar149,local_2f0);
  auVar16 = vcmpps_avx(auVar16,auVar148,1);
  auVar16 = vblendvps_avx(auVar149,auVar148,auVar16);
  auVar20 = vrcpps_avx(auVar17);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = &DAT_3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar17,auVar20,auVar174);
  auVar20 = vfmadd132ps_fma(auVar17,auVar20,auVar20);
  auVar17 = vrcpps_avx(auVar19);
  auVar19 = vfnmadd213ps_fma(auVar19,auVar17,auVar174);
  auVar21 = vfmadd132ps_fma(auVar19,auVar17,auVar17);
  auVar17 = vrcpps_avx(auVar16);
  auVar19 = vfnmadd213ps_fma(auVar16,auVar17,auVar174);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar89 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar95 = vfmadd132ps_fma(auVar19,auVar17,auVar17);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar22);
  auVar149._0_4_ = auVar20._0_4_ * auVar16._0_4_;
  auVar149._4_4_ = auVar20._4_4_ * auVar16._4_4_;
  auVar149._8_4_ = auVar20._8_4_ * auVar16._8_4_;
  auVar149._12_4_ = auVar20._12_4_ * auVar16._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar89 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar22);
  auVar157._0_4_ = auVar20._0_4_ * auVar16._0_4_;
  auVar157._4_4_ = auVar20._4_4_ * auVar16._4_4_;
  auVar157._8_4_ = auVar20._8_4_ * auVar16._8_4_;
  auVar157._12_4_ = auVar20._12_4_ * auVar16._12_4_;
  auVar173 = ZEXT464(CONCAT31(0,PVar10));
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar17 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar89 * -2 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar94);
  auVar179._0_4_ = auVar16._0_4_ * auVar21._0_4_;
  auVar179._4_4_ = auVar16._4_4_ * auVar21._4_4_;
  auVar179._8_4_ = auVar16._8_4_ * auVar21._8_4_;
  auVar179._12_4_ = auVar16._12_4_ * auVar21._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar17);
  auVar16 = vsubps_avx(auVar16,auVar94);
  auVar114._0_4_ = auVar21._0_4_ * auVar16._0_4_;
  auVar114._4_4_ = auVar21._4_4_ * auVar16._4_4_;
  auVar114._8_4_ = auVar21._8_4_ * auVar16._8_4_;
  auVar114._12_4_ = auVar21._12_4_ * auVar16._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar84 + uVar89 + 6);
  auVar16 = vpmovsxwd_avx(auVar21);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar115);
  auVar143._0_4_ = auVar95._0_4_ * auVar16._0_4_;
  auVar143._4_4_ = auVar95._4_4_ * auVar16._4_4_;
  auVar143._8_4_ = auVar95._8_4_ * auVar16._8_4_;
  auVar143._12_4_ = auVar95._12_4_ * auVar16._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar89 * 0x17 + 6);
  auVar16 = vpmovsxwd_avx(auVar22);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar115);
  auVar94._0_4_ = auVar95._0_4_ * auVar16._0_4_;
  auVar94._4_4_ = auVar95._4_4_ * auVar16._4_4_;
  auVar94._8_4_ = auVar95._8_4_ * auVar16._8_4_;
  auVar94._12_4_ = auVar95._12_4_ * auVar16._12_4_;
  auVar16 = vpminsd_avx(auVar149,auVar157);
  auVar17 = vpminsd_avx(auVar179,auVar114);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vpminsd_avx(auVar143,auVar94);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar183._4_4_ = uVar90;
  auVar183._0_4_ = uVar90;
  auVar183._8_4_ = uVar90;
  auVar183._12_4_ = uVar90;
  auVar17 = vmaxps_avx(auVar17,auVar183);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  local_300._0_4_ = auVar16._0_4_ * 0.99999964;
  local_300._4_4_ = auVar16._4_4_ * 0.99999964;
  local_300._8_4_ = auVar16._8_4_ * 0.99999964;
  local_300._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar149,auVar157);
  auVar17 = vpmaxsd_avx(auVar179,auVar114);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar17 = vpmaxsd_avx(auVar143,auVar94);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar130._4_4_ = uVar90;
  auVar130._0_4_ = uVar90;
  auVar130._8_4_ = uVar90;
  auVar130._12_4_ = uVar90;
  auVar17 = vminps_avx(auVar17,auVar130);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar95._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar95._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar95._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar95._12_4_ = auVar16._12_4_ * 1.0000004;
  auVar115[4] = PVar10;
  auVar115._0_4_ = CONCAT31(0,PVar10);
  auVar115._5_3_ = 0;
  auVar115[8] = PVar10;
  auVar115._9_3_ = 0;
  auVar115[0xc] = PVar10;
  auVar115._13_3_ = 0;
  auVar17 = vpcmpgtd_avx(auVar115,_DAT_01ff0cf0);
  auVar16 = vcmpps_avx(local_300,auVar95,2);
  auVar16 = vandps_avx(auVar16,auVar17);
  uVar82 = vmovmskps_avx(auVar16);
  local_84d = uVar82 != 0;
  if (local_84d) {
    uVar82 = uVar82 & 0xff;
    local_4c8 = pre->ray_space + k;
    local_4c0 = mm_lookupmask_ps._16_8_;
    uStack_4b8 = mm_lookupmask_ps._24_8_;
    uStack_4b0 = mm_lookupmask_ps._16_8_;
    uStack_4a8 = mm_lookupmask_ps._24_8_;
    local_638 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    do {
      auVar154 = local_420;
      local_780 = auVar173._0_32_;
      lVar25 = 0;
      uVar89 = (ulong)uVar82;
      for (uVar84 = uVar89; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        lVar25 = lVar25 + 1;
      }
      uVar82 = *(uint *)(prim + 2);
      local_7a8 = (ulong)uVar82;
      uVar11 = *(uint *)(prim + lVar25 * 4 + 6);
      local_510 = (ulong)uVar11;
      pGVar13 = (context->scene->geometries).items[local_7a8].ptr;
      _Var14 = pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      uVar84 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 + _Var14 * local_510);
      p_Var15 = pGVar13[1].intersectionFilterN;
      lVar25 = *(long *)&pGVar13[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar25 + (long)p_Var15 * uVar84);
      local_6f0 = *(undefined8 *)*pauVar1;
      uStack_6e8 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar25 + (uVar84 + 1) * (long)p_Var15);
      local_4e0 = *(undefined8 *)*pauVar2;
      uStack_4d8 = *(undefined8 *)(*pauVar2 + 8);
      uVar87 = (uVar84 + 2) * (long)p_Var15;
      pauVar3 = (undefined1 (*) [16])(lVar25 + uVar87);
      local_4f0 = *(undefined8 *)*pauVar3;
      uStack_4e8 = *(undefined8 *)(*pauVar3 + 8);
      uVar89 = uVar89 - 1 & uVar89;
      pauVar4 = (undefined1 (*) [16])(lVar25 + (uVar84 + 3) * (long)p_Var15);
      local_500 = *(undefined8 *)*pauVar4;
      uStack_4f8 = *(undefined8 *)(*pauVar4 + 8);
      local_240 = *pauVar4;
      if (uVar89 != 0) {
        uVar86 = uVar89 - 1 & uVar89;
        lVar25 = 0;
        for (uVar84 = uVar89; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
          lVar25 = lVar25 + 1;
        }
        uVar87 = (ulong)*(uint *)(*(long *)&pGVar13->field_0x58 +
                                 *(uint *)(prim + lVar25 * 4 + 6) * _Var14) * (long)p_Var15;
        if (uVar86 != 0) {
          for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar12 = (int)pGVar13[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar20 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar17 = vsubps_avx(*pauVar1,auVar20);
      uVar90 = auVar17._0_4_;
      auVar150._4_4_ = uVar90;
      auVar150._0_4_ = uVar90;
      auVar150._8_4_ = uVar90;
      auVar150._12_4_ = uVar90;
      auVar16 = vshufps_avx(auVar17,auVar17,0x55);
      auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
      aVar7 = (local_4c8->vx).field_0;
      aVar8 = (local_4c8->vy).field_0;
      fVar129 = (local_4c8->vz).field_0.m128[0];
      fVar104 = *(float *)((long)&(local_4c8->vz).field_0 + 4);
      fVar106 = *(float *)((long)&(local_4c8->vz).field_0 + 8);
      fVar108 = *(float *)((long)&(local_4c8->vz).field_0 + 0xc);
      auVar166._0_4_ = fVar129 * auVar17._0_4_;
      auVar166._4_4_ = fVar104 * auVar17._4_4_;
      auVar166._8_4_ = fVar106 * auVar17._8_4_;
      auVar166._12_4_ = fVar108 * auVar17._12_4_;
      auVar16 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar8,auVar16);
      auVar22 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar7,auVar150);
      auVar16 = vblendps_avx(auVar22,*pauVar1,8);
      auVar19 = vsubps_avx(*pauVar2,auVar20);
      uVar90 = auVar19._0_4_;
      auVar167._4_4_ = uVar90;
      auVar167._0_4_ = uVar90;
      auVar167._8_4_ = uVar90;
      auVar167._12_4_ = uVar90;
      auVar17 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      auVar190._0_4_ = fVar129 * auVar19._0_4_;
      auVar190._4_4_ = fVar104 * auVar19._4_4_;
      auVar190._8_4_ = fVar106 * auVar19._8_4_;
      auVar190._12_4_ = fVar108 * auVar19._12_4_;
      auVar17 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar8,auVar17);
      auVar95 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar7,auVar167);
      auVar17 = vblendps_avx(auVar95,*pauVar2,8);
      auVar21 = vsubps_avx(*pauVar3,auVar20);
      uVar90 = auVar21._0_4_;
      auVar175._4_4_ = uVar90;
      auVar175._0_4_ = uVar90;
      auVar175._8_4_ = uVar90;
      auVar175._12_4_ = uVar90;
      auVar19 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar196._0_4_ = fVar129 * auVar21._0_4_;
      auVar196._4_4_ = fVar104 * auVar21._4_4_;
      auVar196._8_4_ = fVar106 * auVar21._8_4_;
      auVar196._12_4_ = fVar108 * auVar21._12_4_;
      auVar19 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar8,auVar19);
      auVar94 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar7,auVar175);
      auVar19 = vblendps_avx(auVar94,*pauVar3,8);
      auVar21 = vsubps_avx(*pauVar4,auVar20);
      uVar90 = auVar21._0_4_;
      auVar176._4_4_ = uVar90;
      auVar176._0_4_ = uVar90;
      auVar176._8_4_ = uVar90;
      auVar176._12_4_ = uVar90;
      auVar20 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar198._0_4_ = fVar129 * auVar21._0_4_;
      auVar198._4_4_ = fVar104 * auVar21._4_4_;
      auVar198._8_4_ = fVar106 * auVar21._8_4_;
      auVar198._12_4_ = fVar108 * auVar21._12_4_;
      auVar20 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar8,auVar20);
      auVar115 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar7,auVar176);
      auVar20 = vblendps_avx(auVar115,*pauVar4,8);
      auVar16 = vandps_avx(auVar16,local_2f0);
      auVar17 = vandps_avx(auVar17,local_2f0);
      auVar21 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vandps_avx(auVar19,local_2f0);
      auVar17 = vandps_avx(auVar20,local_2f0);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar21,auVar16);
      auVar17 = vmovshdup_avx(auVar16);
      auVar17 = vmaxss_avx(auVar17,auVar16);
      auVar16 = vshufpd_avx(auVar16,auVar16,1);
      auVar16 = vmaxss_avx(auVar16,auVar17);
      lVar25 = (long)iVar12 * 0x44;
      auVar17 = vmovshdup_avx(auVar22);
      uVar91 = auVar17._0_8_;
      local_440._8_8_ = uVar91;
      local_440._0_8_ = uVar91;
      local_440._16_8_ = uVar91;
      local_440._24_8_ = uVar91;
      auVar9 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x484);
      auVar17 = vmovshdup_avx(auVar95);
      uVar91 = auVar17._0_8_;
      local_6e0._8_8_ = uVar91;
      local_6e0._0_8_ = uVar91;
      local_6e0._16_8_ = uVar91;
      local_6e0._24_8_ = uVar91;
      auVar165 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x908);
      uVar194 = auVar94._0_4_;
      local_6c0._4_4_ = uVar194;
      local_6c0._0_4_ = uVar194;
      local_6c0._8_4_ = uVar194;
      local_6c0._12_4_ = uVar194;
      local_6c0._16_4_ = uVar194;
      local_6c0._20_4_ = uVar194;
      local_6c0._24_4_ = uVar194;
      local_6c0._28_4_ = uVar194;
      auVar17 = vmovshdup_avx(auVar94);
      uVar91 = auVar17._0_8_;
      local_680._8_8_ = uVar91;
      local_680._0_8_ = uVar91;
      local_680._16_8_ = uVar91;
      local_680._24_8_ = uVar91;
      fVar104 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar25 + 0xd8c);
      fVar106 = *(float *)(bezier_basis0 + lVar25 + 0xd90);
      fVar108 = *(float *)(bezier_basis0 + lVar25 + 0xd94);
      fVar146 = *(float *)(bezier_basis0 + lVar25 + 0xd98);
      fVar147 = *(float *)(bezier_basis0 + lVar25 + 0xd9c);
      fVar128 = *(float *)(bezier_basis0 + lVar25 + 0xda0);
      fVar105 = *(float *)(bezier_basis0 + lVar25 + 0xda4);
      auVar79 = *(undefined1 (*) [28])(bezier_basis0 + lVar25 + 0xd8c);
      local_660 = auVar115._0_4_;
      auVar17 = vmovshdup_avx(auVar115);
      local_720 = auVar17._0_8_;
      auVar123._0_4_ = fVar104 * local_660;
      auVar123._4_4_ = fVar106 * local_660;
      auVar123._8_4_ = fVar108 * local_660;
      auVar123._12_4_ = fVar146 * local_660;
      auVar123._16_4_ = fVar147 * local_660;
      auVar123._20_4_ = fVar128 * local_660;
      auVar123._24_4_ = fVar105 * local_660;
      auVar123._28_4_ = 0;
      fVar219 = auVar17._0_4_;
      auVar97._0_4_ = fVar219 * fVar104;
      fVar221 = auVar17._4_4_;
      auVar97._4_4_ = fVar221 * fVar106;
      auVar97._8_4_ = fVar219 * fVar108;
      auVar97._12_4_ = fVar221 * fVar146;
      auVar97._16_4_ = fVar219 * fVar147;
      auVar97._20_4_ = fVar221 * fVar128;
      auVar97._24_4_ = fVar219 * fVar105;
      auVar97._28_4_ = 0;
      auVar17 = vfmadd231ps_fma(auVar123,auVar165,local_6c0);
      auVar19 = vfmadd231ps_fma(auVar97,auVar165,local_680);
      uVar90 = auVar95._0_4_;
      local_740._4_4_ = uVar90;
      local_740._0_4_ = uVar90;
      local_740._8_4_ = uVar90;
      local_740._12_4_ = uVar90;
      local_740._16_4_ = uVar90;
      local_740._20_4_ = uVar90;
      local_740._24_4_ = uVar90;
      local_740._28_4_ = uVar90;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar9,local_740);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar9,local_6e0);
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar25);
      uVar90 = auVar22._0_4_;
      local_760._4_4_ = uVar90;
      local_760._0_4_ = uVar90;
      local_760._8_4_ = uVar90;
      local_760._12_4_ = uVar90;
      local_760._16_4_ = uVar90;
      local_760._20_4_ = uVar90;
      local_760._24_4_ = uVar90;
      local_760._28_4_ = uVar90;
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar97,local_760);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar97,local_440);
      auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x908);
      fVar107 = *(float *)*(undefined1 (*) [28])(bezier_basis1 + lVar25 + 0xd8c);
      fVar109 = *(float *)(bezier_basis1 + lVar25 + 0xd90);
      fVar110 = *(float *)(bezier_basis1 + lVar25 + 0xd94);
      fVar111 = *(float *)(bezier_basis1 + lVar25 + 0xd98);
      fVar112 = *(float *)(bezier_basis1 + lVar25 + 0xd9c);
      fVar197 = *(float *)(bezier_basis1 + lVar25 + 0xda0);
      fVar201 = *(float *)(bezier_basis1 + lVar25 + 0xda4);
      auVar80 = *(undefined1 (*) [28])(bezier_basis1 + lVar25 + 0xd8c);
      auVar161._4_4_ = fVar109 * local_660;
      auVar161._0_4_ = fVar107 * local_660;
      auVar161._8_4_ = fVar110 * local_660;
      auVar161._12_4_ = fVar111 * local_660;
      auVar161._16_4_ = fVar112 * local_660;
      auVar161._20_4_ = fVar197 * local_660;
      auVar161._24_4_ = fVar201 * local_660;
      auVar161._28_4_ = local_660;
      auVar20 = vfmadd231ps_fma(auVar161,auVar123,local_6c0);
      auVar187._4_4_ = fVar221 * fVar109;
      auVar187._0_4_ = fVar219 * fVar107;
      auVar187._8_4_ = fVar219 * fVar110;
      auVar187._12_4_ = fVar221 * fVar111;
      auVar187._16_4_ = fVar219 * fVar112;
      auVar187._20_4_ = fVar221 * fVar197;
      auVar187._24_4_ = fVar219 * fVar201;
      auVar187._28_4_ = uVar194;
      auVar21 = vfmadd231ps_fma(auVar187,auVar123,local_680);
      auVar161 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x484);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar161,local_740);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar161,local_6e0);
      auVar187 = *(undefined1 (*) [32])(bezier_basis1 + lVar25);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar187,local_760);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar187,local_440);
      auVar118 = ZEXT1632(auVar20);
      auVar168 = ZEXT1632(auVar17);
      auVar23 = vsubps_avx(auVar118,auVar168);
      auVar137 = ZEXT1632(auVar21);
      auVar98 = ZEXT1632(auVar19);
      auVar24 = vsubps_avx(auVar137,auVar98);
      auVar99._0_4_ = auVar19._0_4_ * auVar23._0_4_;
      auVar99._4_4_ = auVar19._4_4_ * auVar23._4_4_;
      auVar99._8_4_ = auVar19._8_4_ * auVar23._8_4_;
      auVar99._12_4_ = auVar19._12_4_ * auVar23._12_4_;
      auVar99._16_4_ = auVar23._16_4_ * 0.0;
      auVar99._20_4_ = auVar23._20_4_ * 0.0;
      auVar99._24_4_ = auVar23._24_4_ * 0.0;
      auVar99._28_4_ = 0;
      fVar207 = auVar24._0_4_;
      auVar119._0_4_ = fVar207 * auVar17._0_4_;
      fVar213 = auVar24._4_4_;
      auVar119._4_4_ = fVar213 * auVar17._4_4_;
      fVar214 = auVar24._8_4_;
      auVar119._8_4_ = fVar214 * auVar17._8_4_;
      fVar215 = auVar24._12_4_;
      auVar119._12_4_ = fVar215 * auVar17._12_4_;
      fVar216 = auVar24._16_4_;
      auVar119._16_4_ = fVar216 * 0.0;
      fVar217 = auVar24._20_4_;
      auVar119._20_4_ = fVar217 * 0.0;
      fVar218 = auVar24._24_4_;
      auVar119._24_4_ = fVar218 * 0.0;
      auVar119._28_4_ = 0;
      auVar99 = vsubps_avx(auVar99,auVar119);
      auVar17 = vpermilps_avx(*pauVar1,0xff);
      uVar91 = auVar17._0_8_;
      local_80._8_8_ = uVar91;
      local_80._0_8_ = uVar91;
      local_80._16_8_ = uVar91;
      local_80._24_8_ = uVar91;
      auVar19 = vpermilps_avx(*pauVar2,0xff);
      uVar91 = auVar19._0_8_;
      local_a0._8_8_ = uVar91;
      local_a0._0_8_ = uVar91;
      local_a0._16_8_ = uVar91;
      local_a0._24_8_ = uVar91;
      auVar19 = vpermilps_avx(*pauVar3,0xff);
      uVar91 = auVar19._0_8_;
      local_c0._8_8_ = uVar91;
      local_c0._0_8_ = uVar91;
      local_c0._16_8_ = uVar91;
      local_c0._24_8_ = uVar91;
      auVar19 = vpermilps_avx(*pauVar4,0xff);
      local_e0 = auVar19._0_8_;
      fVar129 = auVar19._0_4_;
      auVar169._0_4_ = fVar104 * fVar129;
      fVar104 = auVar19._4_4_;
      auVar169._4_4_ = fVar106 * fVar104;
      auVar169._8_4_ = fVar108 * fVar129;
      auVar169._12_4_ = fVar146 * fVar104;
      auVar169._16_4_ = fVar147 * fVar129;
      auVar169._20_4_ = fVar128 * fVar104;
      auVar169._24_4_ = fVar105 * fVar129;
      auVar169._28_4_ = 0;
      auVar19 = vfmadd231ps_fma(auVar169,local_c0,auVar165);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_a0,auVar9);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar97,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar18._4_4_ = fVar109 * fVar104;
      auVar18._0_4_ = fVar107 * fVar129;
      auVar18._8_4_ = fVar110 * fVar129;
      auVar18._12_4_ = fVar111 * fVar104;
      auVar18._16_4_ = fVar112 * fVar129;
      auVar18._20_4_ = fVar197 * fVar104;
      auVar18._24_4_ = fVar201 * fVar129;
      auVar18._28_4_ = auVar97._28_4_;
      auVar20 = vfmadd231ps_fma(auVar18,auVar123,local_c0);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar161,local_a0);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar187,local_80);
      auVar125._4_4_ = fVar213 * fVar213;
      auVar125._0_4_ = fVar207 * fVar207;
      auVar125._8_4_ = fVar214 * fVar214;
      auVar125._12_4_ = fVar215 * fVar215;
      auVar125._16_4_ = fVar216 * fVar216;
      auVar125._20_4_ = fVar217 * fVar217;
      auVar125._24_4_ = fVar218 * fVar218;
      auVar125._28_4_ = auVar17._4_4_;
      auVar17 = vfmadd231ps_fma(auVar125,auVar23,auVar23);
      auVar18 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar20));
      auVar140._4_4_ = auVar18._4_4_ * auVar18._4_4_ * auVar17._4_4_;
      auVar140._0_4_ = auVar18._0_4_ * auVar18._0_4_ * auVar17._0_4_;
      auVar140._8_4_ = auVar18._8_4_ * auVar18._8_4_ * auVar17._8_4_;
      auVar140._12_4_ = auVar18._12_4_ * auVar18._12_4_ * auVar17._12_4_;
      auVar140._16_4_ = auVar18._16_4_ * auVar18._16_4_ * 0.0;
      auVar140._20_4_ = auVar18._20_4_ * auVar18._20_4_ * 0.0;
      auVar140._24_4_ = auVar18._24_4_ * auVar18._24_4_ * 0.0;
      auVar140._28_4_ = auVar18._28_4_;
      auVar171._4_4_ = auVar99._4_4_ * auVar99._4_4_;
      auVar171._0_4_ = auVar99._0_4_ * auVar99._0_4_;
      auVar171._8_4_ = auVar99._8_4_ * auVar99._8_4_;
      auVar171._12_4_ = auVar99._12_4_ * auVar99._12_4_;
      auVar171._16_4_ = auVar99._16_4_ * auVar99._16_4_;
      auVar171._20_4_ = auVar99._20_4_ * auVar99._20_4_;
      auVar171._24_4_ = auVar99._24_4_ * auVar99._24_4_;
      auVar171._28_4_ = auVar99._28_4_;
      auVar18 = vcmpps_avx(auVar171,auVar140,2);
      auVar142 = ZEXT3264(auVar18);
      fVar129 = auVar16._0_4_ * 4.7683716e-07;
      auVar100._0_4_ = (float)iVar12;
      local_420._4_12_ = auVar94._4_12_;
      local_420._0_4_ = auVar100._0_4_;
      local_420._16_16_ = auVar154._16_16_;
      auVar100._4_4_ = auVar100._0_4_;
      auVar100._8_4_ = auVar100._0_4_;
      auVar100._12_4_ = auVar100._0_4_;
      auVar100._16_4_ = auVar100._0_4_;
      auVar100._20_4_ = auVar100._0_4_;
      auVar100._24_4_ = auVar100._0_4_;
      auVar100._28_4_ = auVar100._0_4_;
      auVar154 = vcmpps_avx(_DAT_02020f40,auVar100,1);
      auVar17 = vpermilps_avx(auVar22,0xaa);
      uVar91 = auVar17._0_8_;
      local_4a0._8_8_ = uVar91;
      local_4a0._0_8_ = uVar91;
      local_4a0._16_8_ = uVar91;
      local_4a0._24_8_ = uVar91;
      auVar16 = vpermilps_avx(auVar95,0xaa);
      uVar91 = auVar16._0_8_;
      auVar220._8_8_ = uVar91;
      auVar220._0_8_ = uVar91;
      auVar220._16_8_ = uVar91;
      auVar220._24_8_ = uVar91;
      auVar16 = vshufps_avx(auVar94,auVar94,0xaa);
      uVar91 = auVar16._0_8_;
      local_140._8_8_ = uVar91;
      local_140._0_8_ = uVar91;
      local_140._16_8_ = uVar91;
      local_140._24_8_ = uVar91;
      auVar16 = vshufps_avx(auVar115,auVar115,0xaa);
      uVar91 = auVar16._0_8_;
      auVar99 = auVar154 & auVar18;
      uVar83 = *(uint *)(ray + k * 4 + 0x30);
      local_7a0._0_16_ = ZEXT416(uVar83);
      fVar104 = fVar219;
      fVar106 = fVar221;
      fVar108 = fVar219;
      fVar146 = fVar221;
      fVar147 = fVar219;
      uStack_598 = uVar91;
      uStack_590 = uVar91;
      uStack_588 = uVar91;
      uStack_718 = local_720;
      uStack_710 = local_720;
      uStack_708 = local_720;
      fStack_65c = local_660;
      fStack_658 = local_660;
      fStack_654 = local_660;
      fStack_650 = local_660;
      fStack_64c = local_660;
      fStack_648 = local_660;
      fStack_644 = local_660;
      local_510._0_4_ = uVar11;
      if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar99 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar99 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar99 >> 0x7f,0) == '\0') &&
            (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar99 >> 0xbf,0) == '\0') &&
          (auVar99 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar99[0x1f])
      {
        uVar87 = 0;
        auVar173 = ZEXT3264(local_780);
        auVar127 = ZEXT3264(local_6e0);
        auVar182 = ZEXT3264(local_6c0);
        auVar188 = ZEXT3264(local_680);
        auVar177 = ZEXT3264(CONCAT428(local_660,
                                      CONCAT424(local_660,
                                                CONCAT420(local_660,
                                                          CONCAT416(local_660,
                                                                    CONCAT412(local_660,
                                                                              CONCAT48(local_660,
                                                                                       CONCAT44(
                                                  local_660,local_660))))))));
        auVar212 = ZEXT3264(local_740);
        auVar193 = ZEXT3264(local_760);
      }
      else {
        auVar18 = vandps_avx(auVar18,auVar154);
        local_580._0_4_ = auVar80._0_4_;
        local_580._4_4_ = auVar80._4_4_;
        uStack_578._0_4_ = auVar80._8_4_;
        uStack_578._4_4_ = auVar80._12_4_;
        auStack_570._0_4_ = auVar80._16_4_;
        auStack_570._4_4_ = auVar80._20_4_;
        fStack_568 = auVar80._24_4_;
        fVar197 = auVar16._0_4_;
        fVar201 = auVar16._4_4_;
        auVar154._4_4_ = fVar201 * (float)local_580._4_4_;
        auVar154._0_4_ = fVar197 * (float)local_580._0_4_;
        auVar154._8_4_ = fVar197 * (float)uStack_578;
        auVar154._12_4_ = fVar201 * uStack_578._4_4_;
        auVar154._16_4_ = fVar197 * (float)auStack_570._0_4_;
        auVar154._20_4_ = fVar201 * (float)auStack_570._4_4_;
        auVar154._24_4_ = fVar197 * fStack_568;
        auVar154._28_4_ = auVar18._28_4_;
        auVar16 = vfmadd213ps_fma(auVar123,local_140,auVar154);
        auVar16 = vfmadd213ps_fma(auVar161,auVar220,ZEXT1632(auVar16));
        auVar16 = vfmadd213ps_fma(auVar187,local_4a0,ZEXT1632(auVar16));
        local_600._0_4_ = auVar79._0_4_;
        local_600._4_4_ = auVar79._4_4_;
        uStack_5f8._0_4_ = auVar79._8_4_;
        uStack_5f8._4_4_ = auVar79._12_4_;
        auStack_5f0._0_4_ = auVar79._16_4_;
        auStack_5f0._4_4_ = auVar79._20_4_;
        fStack_5e8 = auVar79._24_4_;
        auVar27._4_4_ = fVar201 * (float)local_600._4_4_;
        auVar27._0_4_ = fVar197 * (float)local_600._0_4_;
        auVar27._8_4_ = fVar197 * (float)uStack_5f8;
        auVar27._12_4_ = fVar201 * uStack_5f8._4_4_;
        auVar27._16_4_ = fVar197 * (float)auStack_5f0._0_4_;
        auVar27._20_4_ = fVar201 * (float)auStack_5f0._4_4_;
        auVar27._24_4_ = fVar197 * fStack_5e8;
        auVar27._28_4_ = auVar18._28_4_;
        auVar21 = vfmadd213ps_fma(auVar165,local_140,auVar27);
        auVar21 = vfmadd213ps_fma(auVar9,auVar220,ZEXT1632(auVar21));
        auVar154 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1210);
        auVar9 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1694);
        auVar165 = *(undefined1 (*) [32])(bezier_basis0 + lVar25 + 0x1b18);
        fVar128 = *(float *)(bezier_basis0 + lVar25 + 0x1f9c);
        fVar105 = *(float *)(bezier_basis0 + lVar25 + 0x1fa0);
        fVar107 = *(float *)(bezier_basis0 + lVar25 + 0x1fa4);
        fVar109 = *(float *)(bezier_basis0 + lVar25 + 0x1fa8);
        fVar110 = *(float *)(bezier_basis0 + lVar25 + 0x1fac);
        fVar111 = *(float *)(bezier_basis0 + lVar25 + 0x1fb0);
        fVar112 = *(float *)(bezier_basis0 + lVar25 + 0x1fb4);
        auVar160._0_4_ = local_660 * fVar128;
        auVar160._4_4_ = local_660 * fVar105;
        auVar160._8_4_ = local_660 * fVar107;
        auVar160._12_4_ = local_660 * fVar109;
        auVar160._16_4_ = local_660 * fVar110;
        auVar160._20_4_ = local_660 * fVar111;
        auVar160._24_4_ = local_660 * fVar112;
        auVar160._28_4_ = 0;
        auVar180._0_4_ = fVar219 * fVar128;
        auVar180._4_4_ = fVar221 * fVar105;
        auVar180._8_4_ = fVar219 * fVar107;
        auVar180._12_4_ = fVar221 * fVar109;
        auVar180._16_4_ = fVar219 * fVar110;
        auVar180._20_4_ = fVar221 * fVar111;
        auVar180._24_4_ = fVar219 * fVar112;
        auVar180._28_4_ = 0;
        auVar28._4_4_ = fVar201 * fVar105;
        auVar28._0_4_ = fVar197 * fVar128;
        auVar28._8_4_ = fVar197 * fVar107;
        auVar28._12_4_ = fVar201 * fVar109;
        auVar28._16_4_ = fVar197 * fVar110;
        auVar28._20_4_ = fVar201 * fVar111;
        auVar28._24_4_ = fVar197 * fVar112;
        auVar28._28_4_ = fVar201;
        auVar22 = vfmadd231ps_fma(auVar160,auVar165,local_6c0);
        auVar95 = vfmadd231ps_fma(auVar180,auVar165,local_680);
        auVar94 = vfmadd231ps_fma(auVar28,local_140,auVar165);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar9,local_740);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar9,local_6e0);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar9,auVar220);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar154,local_760);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar154,local_440);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_4a0,auVar154);
        fVar128 = *(float *)(bezier_basis1 + lVar25 + 0x1f9c);
        fVar105 = *(float *)(bezier_basis1 + lVar25 + 0x1fa0);
        fVar107 = *(float *)(bezier_basis1 + lVar25 + 0x1fa4);
        fVar109 = *(float *)(bezier_basis1 + lVar25 + 0x1fa8);
        fVar110 = *(float *)(bezier_basis1 + lVar25 + 0x1fac);
        fVar111 = *(float *)(bezier_basis1 + lVar25 + 0x1fb0);
        fVar112 = *(float *)(bezier_basis1 + lVar25 + 0x1fb4);
        auVar9._4_4_ = local_660 * fVar105;
        auVar9._0_4_ = local_660 * fVar128;
        auVar9._8_4_ = local_660 * fVar107;
        auVar9._12_4_ = local_660 * fVar109;
        auVar9._16_4_ = local_660 * fVar110;
        auVar9._20_4_ = local_660 * fVar111;
        auVar9._24_4_ = local_660 * fVar112;
        auVar9._28_4_ = auVar154._28_4_;
        auVar165._4_4_ = fVar221 * fVar105;
        auVar165._0_4_ = fVar219 * fVar128;
        auVar165._8_4_ = fVar219 * fVar107;
        auVar165._12_4_ = fVar221 * fVar109;
        auVar165._16_4_ = fVar219 * fVar110;
        auVar165._20_4_ = fVar221 * fVar111;
        auVar165._24_4_ = fVar219 * fVar112;
        auVar165._28_4_ = fVar221;
        auVar29._4_4_ = fVar105 * fVar201;
        auVar29._0_4_ = fVar128 * fVar197;
        auVar29._8_4_ = fVar107 * fVar197;
        auVar29._12_4_ = fVar109 * fVar201;
        auVar29._16_4_ = fVar110 * fVar197;
        auVar29._20_4_ = fVar111 * fVar201;
        auVar29._24_4_ = fVar112 * fVar197;
        auVar29._28_4_ = auVar17._4_4_;
        auVar154 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1b18);
        auVar17 = vfmadd231ps_fma(auVar9,auVar154,local_6c0);
        auVar115 = vfmadd231ps_fma(auVar165,auVar154,local_680);
        auVar114 = vfmadd231ps_fma(auVar29,auVar154,local_140);
        auVar154 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1694);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar154,local_740);
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar154,local_6e0);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar220,auVar154);
        auVar154 = *(undefined1 (*) [32])(bezier_basis1 + lVar25 + 0x1210);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar154,local_760);
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar154,local_440);
        auVar120._8_4_ = 0x7fffffff;
        auVar120._0_8_ = 0x7fffffff7fffffff;
        auVar120._12_4_ = 0x7fffffff;
        auVar120._16_4_ = 0x7fffffff;
        auVar120._20_4_ = 0x7fffffff;
        auVar120._24_4_ = 0x7fffffff;
        auVar120._28_4_ = 0x7fffffff;
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),local_4a0,auVar154);
        auVar154 = vandps_avx(ZEXT1632(auVar22),auVar120);
        auVar9 = vandps_avx(ZEXT1632(auVar95),auVar120);
        auVar9 = vmaxps_avx(auVar154,auVar9);
        auVar154 = vandps_avx(ZEXT1632(auVar94),auVar120);
        auVar154 = vmaxps_avx(auVar9,auVar154);
        auVar138._4_4_ = fVar129;
        auVar138._0_4_ = fVar129;
        auVar138._8_4_ = fVar129;
        auVar138._12_4_ = fVar129;
        auVar138._16_4_ = fVar129;
        auVar138._20_4_ = fVar129;
        auVar138._24_4_ = fVar129;
        auVar138._28_4_ = fVar129;
        auVar154 = vcmpps_avx(auVar154,auVar138,1);
        auVar165 = vblendvps_avx(ZEXT1632(auVar22),auVar23,auVar154);
        auVar123 = vblendvps_avx(ZEXT1632(auVar95),auVar24,auVar154);
        auVar154 = vandps_avx(ZEXT1632(auVar17),auVar120);
        auVar9 = vandps_avx(ZEXT1632(auVar115),auVar120);
        auVar161 = vmaxps_avx(auVar154,auVar9);
        auVar154 = vandps_avx(ZEXT1632(auVar114),auVar120);
        auVar154 = vmaxps_avx(auVar161,auVar154);
        auVar187 = vcmpps_avx(auVar154,auVar138,1);
        auVar154 = vblendvps_avx(ZEXT1632(auVar17),auVar23,auVar187);
        auVar161 = vblendvps_avx(ZEXT1632(auVar115),auVar24,auVar187);
        auVar17 = vfmadd213ps_fma(auVar97,local_4a0,ZEXT1632(auVar21));
        auVar21 = vfmadd213ps_fma(auVar165,auVar165,ZEXT832(0) << 0x20);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar123,auVar123);
        auVar97 = vrsqrtps_avx(ZEXT1632(auVar21));
        fVar128 = auVar97._0_4_;
        fVar105 = auVar97._4_4_;
        fVar107 = auVar97._8_4_;
        fVar109 = auVar97._12_4_;
        fVar110 = auVar97._16_4_;
        fVar111 = auVar97._20_4_;
        fVar112 = auVar97._24_4_;
        auVar23._4_4_ = fVar105 * fVar105 * fVar105 * auVar21._4_4_ * -0.5;
        auVar23._0_4_ = fVar128 * fVar128 * fVar128 * auVar21._0_4_ * -0.5;
        auVar23._8_4_ = fVar107 * fVar107 * fVar107 * auVar21._8_4_ * -0.5;
        auVar23._12_4_ = fVar109 * fVar109 * fVar109 * auVar21._12_4_ * -0.5;
        auVar23._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar23._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar23._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar23._28_4_ = auVar9._28_4_;
        auVar210._8_4_ = 0x3fc00000;
        auVar210._0_8_ = 0x3fc000003fc00000;
        auVar210._12_4_ = 0x3fc00000;
        auVar210._16_4_ = 0x3fc00000;
        auVar210._20_4_ = 0x3fc00000;
        auVar210._24_4_ = 0x3fc00000;
        auVar210._28_4_ = 0x3fc00000;
        auVar21 = vfmadd231ps_fma(auVar23,auVar210,auVar97);
        fVar128 = auVar21._0_4_;
        fVar105 = auVar21._4_4_;
        auVar30._4_4_ = fVar105 * auVar123._4_4_;
        auVar30._0_4_ = fVar128 * auVar123._0_4_;
        fVar107 = auVar21._8_4_;
        auVar30._8_4_ = fVar107 * auVar123._8_4_;
        fVar109 = auVar21._12_4_;
        auVar30._12_4_ = fVar109 * auVar123._12_4_;
        auVar30._16_4_ = auVar123._16_4_ * 0.0;
        auVar30._20_4_ = auVar123._20_4_ * 0.0;
        auVar30._24_4_ = auVar123._24_4_ * 0.0;
        auVar30._28_4_ = 0;
        auVar31._4_4_ = fVar105 * -auVar165._4_4_;
        auVar31._0_4_ = fVar128 * -auVar165._0_4_;
        auVar31._8_4_ = fVar107 * -auVar165._8_4_;
        auVar31._12_4_ = fVar109 * -auVar165._12_4_;
        auVar31._16_4_ = -auVar165._16_4_ * 0.0;
        auVar31._20_4_ = -auVar165._20_4_ * 0.0;
        auVar31._24_4_ = -auVar165._24_4_ * 0.0;
        auVar31._28_4_ = auVar97._28_4_;
        auVar21 = vfmadd213ps_fma(auVar154,auVar154,ZEXT832(0) << 0x20);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar161,auVar161);
        auVar9 = vrsqrtps_avx(ZEXT1632(auVar21));
        auVar32._28_4_ = auVar187._28_4_;
        auVar32._0_28_ =
             ZEXT1628(CONCAT412(fVar109 * 0.0,
                                CONCAT48(fVar107 * 0.0,CONCAT44(fVar105 * 0.0,fVar128 * 0.0))));
        fVar128 = auVar9._0_4_;
        fVar105 = auVar9._4_4_;
        fVar107 = auVar9._8_4_;
        fVar109 = auVar9._12_4_;
        fVar110 = auVar9._16_4_;
        fVar111 = auVar9._20_4_;
        fVar112 = auVar9._24_4_;
        auVar33._4_4_ = fVar105 * fVar105 * fVar105 * auVar21._4_4_ * -0.5;
        auVar33._0_4_ = fVar128 * fVar128 * fVar128 * auVar21._0_4_ * -0.5;
        auVar33._8_4_ = fVar107 * fVar107 * fVar107 * auVar21._8_4_ * -0.5;
        auVar33._12_4_ = fVar109 * fVar109 * fVar109 * auVar21._12_4_ * -0.5;
        auVar33._16_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar33._20_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar33._24_4_ = fVar112 * fVar112 * fVar112 * -0.0;
        auVar33._28_4_ = 0;
        auVar21 = vfmadd231ps_fma(auVar33,auVar210,auVar9);
        fVar128 = auVar21._0_4_;
        auVar191._0_4_ = auVar161._0_4_ * fVar128;
        fVar105 = auVar21._4_4_;
        auVar191._4_4_ = auVar161._4_4_ * fVar105;
        fVar107 = auVar21._8_4_;
        auVar191._8_4_ = auVar161._8_4_ * fVar107;
        fVar109 = auVar21._12_4_;
        auVar191._12_4_ = auVar161._12_4_ * fVar109;
        auVar191._16_4_ = auVar161._16_4_ * 0.0;
        auVar191._20_4_ = auVar161._20_4_ * 0.0;
        auVar191._24_4_ = auVar161._24_4_ * 0.0;
        auVar191._28_4_ = 0;
        auVar34._4_4_ = -auVar154._4_4_ * fVar105;
        auVar34._0_4_ = -auVar154._0_4_ * fVar128;
        auVar34._8_4_ = -auVar154._8_4_ * fVar107;
        auVar34._12_4_ = -auVar154._12_4_ * fVar109;
        auVar34._16_4_ = -auVar154._16_4_ * 0.0;
        auVar34._20_4_ = -auVar154._20_4_ * 0.0;
        auVar34._24_4_ = -auVar154._24_4_ * 0.0;
        auVar34._28_4_ = auVar161._28_4_;
        auVar35._28_4_ = auVar9._28_4_;
        auVar35._0_28_ =
             ZEXT1628(CONCAT412(fVar109 * 0.0,
                                CONCAT48(fVar107 * 0.0,CONCAT44(fVar105 * 0.0,fVar128 * 0.0))));
        auVar21 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar19),auVar168);
        auVar154 = ZEXT1632(auVar19);
        auVar22 = vfmadd213ps_fma(auVar31,auVar154,auVar98);
        auVar95 = vfmadd213ps_fma(auVar32,auVar154,ZEXT1632(auVar17));
        auVar114 = vfnmadd213ps_fma(auVar30,auVar154,auVar168);
        auVar94 = vfmadd213ps_fma(auVar191,ZEXT1632(auVar20),auVar118);
        auVar93 = vfnmadd213ps_fma(auVar31,auVar154,auVar98);
        auVar154 = ZEXT1632(auVar20);
        auVar115 = vfmadd213ps_fma(auVar34,auVar154,auVar137);
        local_5e0 = ZEXT1632(auVar19);
        auVar149 = vfnmadd231ps_fma(ZEXT1632(auVar17),local_5e0,auVar32);
        auVar17 = vfmadd213ps_fma(auVar35,auVar154,ZEXT1632(auVar16));
        auVar130 = vfnmadd213ps_fma(auVar191,auVar154,auVar118);
        auVar143 = vfnmadd213ps_fma(auVar34,auVar154,auVar137);
        auVar92 = vfnmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar20),auVar35);
        auVar154 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar93));
        auVar9 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar149));
        auVar98._4_4_ = auVar149._4_4_ * auVar154._4_4_;
        auVar98._0_4_ = auVar149._0_4_ * auVar154._0_4_;
        auVar98._8_4_ = auVar149._8_4_ * auVar154._8_4_;
        auVar98._12_4_ = auVar149._12_4_ * auVar154._12_4_;
        auVar98._16_4_ = auVar154._16_4_ * 0.0;
        auVar98._20_4_ = auVar154._20_4_ * 0.0;
        auVar98._24_4_ = auVar154._24_4_ * 0.0;
        auVar98._28_4_ = 0;
        auVar19 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar93),auVar9);
        auVar118._4_4_ = auVar9._4_4_ * auVar114._4_4_;
        auVar118._0_4_ = auVar9._0_4_ * auVar114._0_4_;
        auVar118._8_4_ = auVar9._8_4_ * auVar114._8_4_;
        auVar118._12_4_ = auVar9._12_4_ * auVar114._12_4_;
        auVar118._16_4_ = auVar9._16_4_ * 0.0;
        auVar118._20_4_ = auVar9._20_4_ * 0.0;
        auVar118._24_4_ = auVar9._24_4_ * 0.0;
        auVar118._28_4_ = auVar9._28_4_;
        auVar9 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar114));
        auVar16 = vfmsub231ps_fma(auVar118,ZEXT1632(auVar149),auVar9);
        auVar137._4_4_ = auVar93._4_4_ * auVar9._4_4_;
        auVar137._0_4_ = auVar93._0_4_ * auVar9._0_4_;
        auVar137._8_4_ = auVar93._8_4_ * auVar9._8_4_;
        auVar137._12_4_ = auVar93._12_4_ * auVar9._12_4_;
        auVar137._16_4_ = auVar9._16_4_ * 0.0;
        auVar137._20_4_ = auVar9._20_4_ * 0.0;
        auVar137._24_4_ = auVar9._24_4_ * 0.0;
        auVar137._28_4_ = auVar9._28_4_;
        auVar161 = ZEXT1632(auVar114);
        auVar114 = vfmsub231ps_fma(auVar137,auVar161,auVar154);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar114),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
        auVar99 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,2);
        auVar154 = vblendvps_avx(ZEXT1632(auVar130),ZEXT1632(auVar21),auVar99);
        auVar9 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar22),auVar99);
        local_5c0 = vblendvps_avx(ZEXT1632(auVar92),ZEXT1632(auVar95),auVar99);
        auVar165 = vblendvps_avx(auVar161,ZEXT1632(auVar94),auVar99);
        auVar97 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar115),auVar99);
        auVar123 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar17),auVar99);
        auVar161 = vblendvps_avx(ZEXT1632(auVar94),auVar161,auVar99);
        auVar187 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar93),auVar99);
        auVar16 = vpackssdw_avx(auVar18._0_16_,auVar18._16_16_);
        auVar23 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar149),auVar99);
        auVar125 = vsubps_avx(auVar161,auVar154);
        auVar140 = vsubps_avx(auVar187,auVar9);
        auVar171 = vsubps_avx(auVar23,local_5c0);
        auVar98 = vsubps_avx(auVar154,auVar165);
        auVar118 = vsubps_avx(auVar9,auVar97);
        auVar119 = vsubps_avx(local_5c0,auVar123);
        auVar168._4_4_ = auVar171._4_4_ * auVar154._4_4_;
        auVar168._0_4_ = auVar171._0_4_ * auVar154._0_4_;
        auVar168._8_4_ = auVar171._8_4_ * auVar154._8_4_;
        auVar168._12_4_ = auVar171._12_4_ * auVar154._12_4_;
        auVar168._16_4_ = auVar171._16_4_ * auVar154._16_4_;
        auVar168._20_4_ = auVar171._20_4_ * auVar154._20_4_;
        auVar168._24_4_ = auVar171._24_4_ * auVar154._24_4_;
        auVar168._28_4_ = auVar23._28_4_;
        auVar17 = vfmsub231ps_fma(auVar168,local_5c0,auVar125);
        auVar36._4_4_ = auVar125._4_4_ * auVar9._4_4_;
        auVar36._0_4_ = auVar125._0_4_ * auVar9._0_4_;
        auVar36._8_4_ = auVar125._8_4_ * auVar9._8_4_;
        auVar36._12_4_ = auVar125._12_4_ * auVar9._12_4_;
        auVar36._16_4_ = auVar125._16_4_ * auVar9._16_4_;
        auVar36._20_4_ = auVar125._20_4_ * auVar9._20_4_;
        auVar36._24_4_ = auVar125._24_4_ * auVar9._24_4_;
        auVar36._28_4_ = auVar161._28_4_;
        auVar19 = vfmsub231ps_fma(auVar36,auVar154,auVar140);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar101._0_4_ = auVar140._0_4_ * local_5c0._0_4_;
        auVar101._4_4_ = auVar140._4_4_ * local_5c0._4_4_;
        auVar101._8_4_ = auVar140._8_4_ * local_5c0._8_4_;
        auVar101._12_4_ = auVar140._12_4_ * local_5c0._12_4_;
        auVar101._16_4_ = auVar140._16_4_ * local_5c0._16_4_;
        auVar101._20_4_ = auVar140._20_4_ * local_5c0._20_4_;
        auVar101._24_4_ = auVar140._24_4_ * local_5c0._24_4_;
        auVar101._28_4_ = 0;
        auVar19 = vfmsub231ps_fma(auVar101,auVar9,auVar171);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
        auVar142 = ZEXT1664(auVar19);
        auVar102._0_4_ = auVar119._0_4_ * auVar165._0_4_;
        auVar102._4_4_ = auVar119._4_4_ * auVar165._4_4_;
        auVar102._8_4_ = auVar119._8_4_ * auVar165._8_4_;
        auVar102._12_4_ = auVar119._12_4_ * auVar165._12_4_;
        auVar102._16_4_ = auVar119._16_4_ * auVar165._16_4_;
        auVar102._20_4_ = auVar119._20_4_ * auVar165._20_4_;
        auVar102._24_4_ = auVar119._24_4_ * auVar165._24_4_;
        auVar102._28_4_ = 0;
        auVar17 = vfmsub231ps_fma(auVar102,auVar98,auVar123);
        auVar37._4_4_ = auVar118._4_4_ * auVar123._4_4_;
        auVar37._0_4_ = auVar118._0_4_ * auVar123._0_4_;
        auVar37._8_4_ = auVar118._8_4_ * auVar123._8_4_;
        auVar37._12_4_ = auVar118._12_4_ * auVar123._12_4_;
        auVar37._16_4_ = auVar118._16_4_ * auVar123._16_4_;
        auVar37._20_4_ = auVar118._20_4_ * auVar123._20_4_;
        auVar37._24_4_ = auVar118._24_4_ * auVar123._24_4_;
        auVar37._28_4_ = auVar123._28_4_;
        auVar21 = vfmsub231ps_fma(auVar37,auVar97,auVar119);
        auVar38._4_4_ = auVar98._4_4_ * auVar97._4_4_;
        auVar38._0_4_ = auVar98._0_4_ * auVar97._0_4_;
        auVar38._8_4_ = auVar98._8_4_ * auVar97._8_4_;
        auVar38._12_4_ = auVar98._12_4_ * auVar97._12_4_;
        auVar38._16_4_ = auVar98._16_4_ * auVar97._16_4_;
        auVar38._20_4_ = auVar98._20_4_ * auVar97._20_4_;
        auVar38._24_4_ = auVar98._24_4_ * auVar97._24_4_;
        auVar38._28_4_ = auVar187._28_4_;
        auVar22 = vfmsub231ps_fma(auVar38,auVar118,auVar165);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        auVar165 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar21));
        auVar165 = vcmpps_avx(auVar165,ZEXT832(0) << 0x20,2);
        auVar17 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
        auVar16 = vpand_avx(auVar17,auVar16);
        auVar165 = vpmovsxwd_avx2(auVar16);
        if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar165 >> 0x7f,0) == '\0') &&
              (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar165 >> 0xbf,0) == '\0') &&
            (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar165[0x1f]) {
LAB_016f7354:
          auVar173 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
        }
        else {
          auVar39._4_4_ = auVar140._4_4_ * auVar119._4_4_;
          auVar39._0_4_ = auVar140._0_4_ * auVar119._0_4_;
          auVar39._8_4_ = auVar140._8_4_ * auVar119._8_4_;
          auVar39._12_4_ = auVar140._12_4_ * auVar119._12_4_;
          auVar39._16_4_ = auVar140._16_4_ * auVar119._16_4_;
          auVar39._20_4_ = auVar140._20_4_ * auVar119._20_4_;
          auVar39._24_4_ = auVar140._24_4_ * auVar119._24_4_;
          auVar39._28_4_ = auVar165._28_4_;
          auVar94 = vfmsub231ps_fma(auVar39,auVar118,auVar171);
          auVar121._0_4_ = auVar171._0_4_ * auVar98._0_4_;
          auVar121._4_4_ = auVar171._4_4_ * auVar98._4_4_;
          auVar121._8_4_ = auVar171._8_4_ * auVar98._8_4_;
          auVar121._12_4_ = auVar171._12_4_ * auVar98._12_4_;
          auVar121._16_4_ = auVar171._16_4_ * auVar98._16_4_;
          auVar121._20_4_ = auVar171._20_4_ * auVar98._20_4_;
          auVar121._24_4_ = auVar171._24_4_ * auVar98._24_4_;
          auVar121._28_4_ = 0;
          auVar95 = vfmsub231ps_fma(auVar121,auVar125,auVar119);
          auVar40._4_4_ = auVar125._4_4_ * auVar118._4_4_;
          auVar40._0_4_ = auVar125._0_4_ * auVar118._0_4_;
          auVar40._8_4_ = auVar125._8_4_ * auVar118._8_4_;
          auVar40._12_4_ = auVar125._12_4_ * auVar118._12_4_;
          auVar40._16_4_ = auVar125._16_4_ * auVar118._16_4_;
          auVar40._20_4_ = auVar125._20_4_ * auVar118._20_4_;
          auVar40._24_4_ = auVar125._24_4_ * auVar118._24_4_;
          auVar40._28_4_ = auVar97._28_4_;
          auVar115 = vfmsub231ps_fma(auVar40,auVar98,auVar140);
          auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar95),ZEXT1632(auVar115));
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar94),_DAT_02020f00);
          auVar165 = vrcpps_avx(ZEXT1632(auVar22));
          auVar192._8_4_ = 0x3f800000;
          auVar192._0_8_ = &DAT_3f8000003f800000;
          auVar192._12_4_ = 0x3f800000;
          auVar192._16_4_ = 0x3f800000;
          auVar192._20_4_ = 0x3f800000;
          auVar192._24_4_ = 0x3f800000;
          auVar192._28_4_ = 0x3f800000;
          auVar17 = vfnmadd213ps_fma(auVar165,ZEXT1632(auVar22),auVar192);
          auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar165,auVar165);
          auVar170._0_4_ = auVar115._0_4_ * local_5c0._0_4_;
          auVar170._4_4_ = auVar115._4_4_ * local_5c0._4_4_;
          auVar170._8_4_ = auVar115._8_4_ * local_5c0._8_4_;
          auVar170._12_4_ = auVar115._12_4_ * local_5c0._12_4_;
          auVar170._16_4_ = local_5c0._16_4_ * 0.0;
          auVar170._20_4_ = local_5c0._20_4_ * 0.0;
          auVar170._24_4_ = local_5c0._24_4_ * 0.0;
          auVar170._28_4_ = 0;
          auVar95 = vfmadd231ps_fma(auVar170,auVar9,ZEXT1632(auVar95));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar94),auVar154);
          fVar128 = auVar17._0_4_;
          fVar105 = auVar17._4_4_;
          fVar107 = auVar17._8_4_;
          fVar109 = auVar17._12_4_;
          auVar165 = ZEXT1632(CONCAT412(fVar109 * auVar95._12_4_,
                                        CONCAT48(fVar107 * auVar95._8_4_,
                                                 CONCAT44(fVar105 * auVar95._4_4_,
                                                          fVar128 * auVar95._0_4_))));
          auVar103._4_4_ = uVar83;
          auVar103._0_4_ = uVar83;
          auVar103._8_4_ = uVar83;
          auVar103._12_4_ = uVar83;
          auVar103._16_4_ = uVar83;
          auVar103._20_4_ = uVar83;
          auVar103._24_4_ = uVar83;
          auVar103._28_4_ = uVar83;
          uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar122._4_4_ = uVar90;
          auVar122._0_4_ = uVar90;
          auVar122._8_4_ = uVar90;
          auVar122._12_4_ = uVar90;
          auVar122._16_4_ = uVar90;
          auVar122._20_4_ = uVar90;
          auVar122._24_4_ = uVar90;
          auVar122._28_4_ = uVar90;
          auVar154 = vcmpps_avx(auVar103,auVar165,2);
          auVar9 = vcmpps_avx(auVar165,auVar122,2);
          auVar154 = vandps_avx(auVar9,auVar154);
          auVar17 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
          auVar16 = vpand_avx(auVar16,auVar17);
          auVar154 = vpmovsxwd_avx2(auVar16);
          if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar154 >> 0x7f,0) == '\0') &&
                (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar154 >> 0xbf,0) == '\0') &&
              (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar154[0x1f]) goto LAB_016f7354;
          auVar154 = vcmpps_avx(ZEXT1632(auVar22),ZEXT832(0) << 0x20,4);
          auVar17 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
          auVar16 = vpand_avx(auVar16,auVar17);
          auVar154 = vpmovsxwd_avx2(auVar16);
          auVar173 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar154 >> 0x7f,0) != '\0') ||
                (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar154 >> 0xbf,0) != '\0') ||
              (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar154[0x1f] < '\0') {
            auVar97 = ZEXT1632(CONCAT412(fVar109 * auVar19._12_4_,
                                         CONCAT48(fVar107 * auVar19._8_4_,
                                                  CONCAT44(fVar105 * auVar19._4_4_,
                                                           fVar128 * auVar19._0_4_))));
            auVar123 = ZEXT1632(CONCAT412(fVar109 * auVar21._12_4_,
                                          CONCAT48(fVar107 * auVar21._8_4_,
                                                   CONCAT44(fVar105 * auVar21._4_4_,
                                                            fVar128 * auVar21._0_4_))));
            auVar153._8_4_ = 0x3f800000;
            auVar153._0_8_ = &DAT_3f8000003f800000;
            auVar153._12_4_ = 0x3f800000;
            auVar153._16_4_ = 0x3f800000;
            auVar153._20_4_ = 0x3f800000;
            auVar153._24_4_ = 0x3f800000;
            auVar153._28_4_ = 0x3f800000;
            auVar9 = vsubps_avx(auVar153,auVar97);
            auVar142 = ZEXT3264(auVar9);
            _local_160 = vblendvps_avx(auVar9,auVar97,auVar99);
            auVar9 = vsubps_avx(auVar153,auVar123);
            local_340 = vblendvps_avx(auVar9,auVar123,auVar99);
            auVar173 = ZEXT3264(auVar154);
            local_780 = auVar165;
          }
        }
        auVar212 = ZEXT3264(local_740);
        auVar193 = ZEXT3264(local_760);
        auVar154 = auVar173._0_32_;
        if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar154 >> 0x7f,0) == '\0') &&
              (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar154 >> 0xbf,0) == '\0') &&
            (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar173[0x1f]) {
          auVar177 = ZEXT3264(CONCAT428(local_660,
                                        CONCAT424(local_660,
                                                  CONCAT420(local_660,
                                                            CONCAT416(local_660,
                                                                      CONCAT412(local_660,
                                                                                CONCAT48(local_660,
                                                                                         CONCAT44(
                                                  local_660,local_660))))))));
        }
        else {
          auVar9 = vsubps_avx(ZEXT1632(auVar20),local_5e0);
          auVar16 = vfmadd213ps_fma(auVar9,_local_160,local_5e0);
          fVar128 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
          auVar41._4_4_ = (auVar16._4_4_ + auVar16._4_4_) * fVar128;
          auVar41._0_4_ = (auVar16._0_4_ + auVar16._0_4_) * fVar128;
          auVar41._8_4_ = (auVar16._8_4_ + auVar16._8_4_) * fVar128;
          auVar41._12_4_ = (auVar16._12_4_ + auVar16._12_4_) * fVar128;
          auVar41._16_4_ = fVar128 * 0.0;
          auVar41._20_4_ = fVar128 * 0.0;
          auVar41._24_4_ = fVar128 * 0.0;
          auVar41._28_4_ = 0;
          auVar173 = ZEXT3264(local_780);
          auVar9 = vcmpps_avx(local_780,auVar41,6);
          auVar165 = auVar154 & auVar9;
          auVar177 = ZEXT3264(CONCAT428(local_660,
                                        CONCAT424(local_660,
                                                  CONCAT420(local_660,
                                                            CONCAT416(local_660,
                                                                      CONCAT412(local_660,
                                                                                CONCAT48(local_660,
                                                                                         CONCAT44(
                                                  local_660,local_660))))))));
          auVar127 = ZEXT3264(auVar220);
          auVar182 = ZEXT3264(local_6c0);
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0x7f,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0xbf,0) != '\0') ||
              (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar165[0x1f] < '\0') {
            local_220 = vandps_avx(auVar9,auVar154);
            auVar124._8_4_ = 0xbf800000;
            auVar124._0_8_ = 0xbf800000bf800000;
            auVar124._12_4_ = 0xbf800000;
            auVar124._16_4_ = 0xbf800000;
            auVar124._20_4_ = 0xbf800000;
            auVar124._24_4_ = 0xbf800000;
            auVar124._28_4_ = 0xbf800000;
            auVar139._8_4_ = 0x40000000;
            auVar139._0_8_ = 0x4000000040000000;
            auVar139._12_4_ = 0x40000000;
            auVar139._16_4_ = 0x40000000;
            auVar139._20_4_ = 0x40000000;
            auVar139._24_4_ = 0x40000000;
            auVar139._28_4_ = 0x40000000;
            auVar16 = vfmadd213ps_fma(local_340,auVar139,auVar124);
            local_2e0 = _local_160;
            local_2c0 = ZEXT1632(auVar16);
            local_280 = 0;
            auVar142 = ZEXT1664(local_240);
            local_340 = local_2c0;
            if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar87 = 0;
              auVar188 = ZEXT3264(local_680);
            }
            else {
              auVar188 = ZEXT3264(local_680);
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (uVar87 = CONCAT71((int7)(uVar87 >> 8),1),
                 pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar128 = 1.0 / auVar100._0_4_;
                auVar142 = ZEXT3264(CONCAT428(fVar128,CONCAT424(fVar128,CONCAT420(fVar128,CONCAT416(
                                                  fVar128,CONCAT412(fVar128,CONCAT48(fVar128,
                                                  CONCAT44(fVar128,fVar128))))))));
                local_200[0] = fVar128 * ((float)local_160._0_4_ + 0.0);
                local_200[1] = fVar128 * ((float)local_160._4_4_ + 1.0);
                local_200[2] = fVar128 * (fStack_158 + 2.0);
                local_200[3] = fVar128 * (fStack_154 + 3.0);
                fStack_1f0 = fVar128 * (fStack_150 + 4.0);
                fStack_1ec = fVar128 * (fStack_14c + 5.0);
                fStack_1e8 = fVar128 * (fStack_148 + 6.0);
                fStack_1e4 = fStack_144 + 7.0;
                local_340._0_8_ = auVar16._0_8_;
                local_340._8_8_ = auVar16._8_8_;
                local_1e0 = local_340._0_8_;
                uStack_1d8 = local_340._8_8_;
                uStack_1d0 = 0;
                uStack_1c8 = 0;
                local_1c0 = local_780;
                uVar83 = vmovmskps_avx(local_220);
                uVar87 = CONCAT71((int7)(uVar87 >> 8),uVar83 != 0);
                uVar202 = uVar91;
                uVar203 = uVar91;
                uVar204 = uVar91;
                if (uVar83 != 0) {
                  uVar84 = 0;
                  uVar85 = (ulong)(uVar83 & 0xff);
                  for (uVar86 = uVar85; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000
                      ) {
                    uVar84 = uVar84 + 1;
                  }
                  local_540._0_16_ = CONCAT412(uVar82,CONCAT48(uVar82,CONCAT44(uVar82,uVar82)));
                  local_540 = ZEXT1632(local_540._0_16_);
                  local_560 = (undefined1  [8])CONCAT44(uVar11,uVar11);
                  _local_560 = CONCAT412(uVar11,CONCAT48(uVar11,local_560));
                  _local_560 = ZEXT1632(_local_560);
                  local_460 = ZEXT1632(*pauVar2);
                  _auStack_5f0 = auVar24._16_16_;
                  _local_600 = *pauVar3;
                  _local_580 = ZEXT1632(*pauVar4);
                  _auStack_470 = auVar18._16_16_;
                  _local_480 = *local_638;
                  local_6a0 = auVar220;
                  local_5a0 = uVar91;
                  local_2a0 = local_780;
                  local_27c = iVar12;
                  local_270 = local_6f0;
                  uStack_268 = uStack_6e8;
                  local_260 = local_4e0;
                  uStack_258 = uStack_4d8;
                  local_250 = local_4f0;
                  uStack_248 = uStack_4e8;
                  do {
                    local_5c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_3c0 = local_200[uVar84];
                    local_3b0 = *(undefined4 *)((long)&local_1e0 + uVar84 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar84 * 4);
                    fVar108 = 1.0 - local_3c0;
                    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar108 * fVar108)),
                                              ZEXT416((uint)(local_3c0 * fVar108)),
                                              ZEXT416(0xc0000000));
                    auVar16 = vfmsub132ss_fma(ZEXT416((uint)(local_3c0 * fVar108)),
                                              ZEXT416((uint)(local_3c0 * local_3c0)),
                                              ZEXT416(0x40000000));
                    fVar104 = auVar16._0_4_ * 3.0;
                    fVar106 = local_3c0 * local_3c0 * 3.0;
                    auVar158._0_4_ = fVar106 * (float)local_580._0_4_;
                    auVar158._4_4_ = fVar106 * (float)local_580._4_4_;
                    auVar158._8_4_ = fVar106 * (float)uStack_578;
                    auVar158._12_4_ = fVar106 * uStack_578._4_4_;
                    auVar131._4_4_ = fVar104;
                    auVar131._0_4_ = fVar104;
                    auVar131._8_4_ = fVar104;
                    auVar131._12_4_ = fVar104;
                    auVar16 = vfmadd132ps_fma(auVar131,auVar158,_local_600);
                    fVar104 = auVar17._0_4_ * 3.0;
                    auVar151._4_4_ = fVar104;
                    auVar151._0_4_ = fVar104;
                    auVar151._8_4_ = fVar104;
                    auVar151._12_4_ = fVar104;
                    auVar16 = vfmadd132ps_fma(auVar151,auVar16,local_460._0_16_);
                    fVar104 = fVar108 * fVar108 * -3.0;
                    local_630.context = context->user;
                    auVar132._4_4_ = fVar104;
                    auVar132._0_4_ = fVar104;
                    auVar132._8_4_ = fVar104;
                    auVar132._12_4_ = fVar104;
                    auVar76._8_8_ = uStack_6e8;
                    auVar76._0_8_ = local_6f0;
                    auVar16 = vfmadd132ps_fma(auVar132,auVar16,auVar76);
                    local_3f0 = auVar16._0_4_;
                    local_3e0 = vshufps_avx(auVar16,auVar16,0x55);
                    local_3d0 = vshufps_avx(auVar16,auVar16,0xaa);
                    auVar142 = ZEXT1664(local_3d0);
                    local_3a0 = local_560;
                    uStack_398 = uStack_558;
                    local_390 = local_540._0_16_;
                    vpcmpeqd_avx2(ZEXT1632(local_540._0_16_),ZEXT1632(local_540._0_16_));
                    uStack_37c = (local_630.context)->instID[0];
                    local_380 = uStack_37c;
                    uStack_378 = uStack_37c;
                    uStack_374 = uStack_37c;
                    uStack_370 = (local_630.context)->instPrimID[0];
                    uStack_36c = uStack_370;
                    uStack_368 = uStack_370;
                    uStack_364 = uStack_370;
                    local_7c0 = local_480;
                    uStack_7b8 = uStack_478;
                    local_630.valid = (int *)&local_7c0;
                    local_630.geometryUserPtr = pGVar13->userPtr;
                    local_630.hit = (RTCHitN *)&local_3f0;
                    local_630.N = 4;
                    local_5e0._0_4_ = (int)uVar87;
                    auVar154 = auVar173._0_32_;
                    local_630.ray = (RTCRayN *)ray;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    fStack_3bc = local_3c0;
                    fStack_3b8 = local_3c0;
                    fStack_3b4 = local_3c0;
                    uStack_3ac = local_3b0;
                    uStack_3a8 = local_3b0;
                    uStack_3a4 = local_3b0;
                    if (pGVar13->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar142 = ZEXT1664(local_3d0);
                      (*pGVar13->occlusionFilterN)(&local_630);
                      uVar87 = (ulong)(uint)local_5e0._0_4_;
                      auVar127 = ZEXT3264(local_6a0);
                      auVar193 = ZEXT3264(local_760);
                      auVar212 = ZEXT3264(local_740);
                      auVar177 = ZEXT3264(CONCAT428(fStack_644,
                                                    CONCAT424(fStack_648,
                                                              CONCAT420(fStack_64c,
                                                                        CONCAT416(fStack_650,
                                                                                  CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                      auVar188 = ZEXT3264(local_680);
                      auVar182 = ZEXT3264(local_6c0);
                      auVar154 = local_780;
                      uVar91 = local_5a0;
                      uVar202 = uStack_598;
                      uVar203 = uStack_590;
                      uVar204 = uStack_588;
                    }
                    auVar173 = ZEXT3264(auVar154);
                    auVar72._8_8_ = uStack_7b8;
                    auVar72._0_8_ = local_7c0;
                    if (auVar72 == (undefined1  [16])0x0) {
                      auVar16 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar16 = auVar16 ^ _DAT_01febe20;
                      fVar219 = (float)local_720;
                      fVar221 = local_720._4_4_;
                      fVar104 = (float)uStack_718;
                      fVar106 = uStack_718._4_4_;
                      fVar108 = (float)uStack_710;
                      fVar146 = uStack_710._4_4_;
                      fVar147 = (float)uStack_708;
                    }
                    else {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar13->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_630);
                        uVar87 = (ulong)(uint)local_5e0._0_4_;
                        auVar127 = ZEXT3264(local_6a0);
                        auVar193 = ZEXT3264(local_760);
                        auVar212 = ZEXT3264(local_740);
                        auVar177 = ZEXT3264(CONCAT428(fStack_644,
                                                      CONCAT424(fStack_648,
                                                                CONCAT420(fStack_64c,
                                                                          CONCAT416(fStack_650,
                                                                                    CONCAT412(
                                                  fStack_654,
                                                  CONCAT48(fStack_658,CONCAT44(fStack_65c,local_660)
                                                          )))))));
                        auVar188 = ZEXT3264(local_680);
                        auVar182 = ZEXT3264(local_6c0);
                        auVar173 = ZEXT3264(local_780);
                        uVar91 = local_5a0;
                        uVar202 = uStack_598;
                        uVar203 = uStack_590;
                        uVar204 = uStack_588;
                      }
                      auVar73._8_8_ = uStack_7b8;
                      auVar73._0_8_ = local_7c0;
                      auVar17 = vpcmpeqd_avx((undefined1  [16])0x0,auVar73);
                      auVar16 = auVar17 ^ _DAT_01febe20;
                      auVar133._8_4_ = 0xff800000;
                      auVar133._0_8_ = 0xff800000ff800000;
                      auVar133._12_4_ = 0xff800000;
                      auVar142 = ZEXT1664(auVar133);
                      auVar17 = vblendvps_avx(auVar133,*(undefined1 (*) [16])(local_630.ray + 0x80),
                                              auVar17);
                      *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar17;
                      fVar219 = (float)local_720;
                      fVar221 = local_720._4_4_;
                      fVar104 = (float)uStack_718;
                      fVar106 = uStack_718._4_4_;
                      fVar108 = (float)uStack_710;
                      fVar146 = uStack_710._4_4_;
                      fVar147 = (float)uStack_708;
                    }
                    auVar220 = auVar127._0_32_;
                    auVar116._8_8_ = 0x100000001;
                    auVar116._0_8_ = 0x100000001;
                    if ((auVar116 & auVar16) != (undefined1  [16])0x0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_5c0._0_4_;
                    uVar86 = uVar84 & 0x3f;
                    uVar84 = 0;
                    uVar85 = uVar85 ^ 1L << uVar86;
                    for (uVar86 = uVar85; (uVar86 & 1) == 0;
                        uVar86 = uVar86 >> 1 | 0x8000000000000000) {
                      uVar84 = uVar84 + 1;
                    }
                    uVar87 = CONCAT71((int7)(uVar87 >> 8),uVar85 != 0);
                  } while (uVar85 != 0);
                }
                uVar87 = uVar87 & 0xffffffffffffff01;
                uStack_598 = uVar202;
                uStack_590 = uVar203;
                uStack_588 = uVar204;
                uVar11 = (uint)local_510;
              }
            }
            local_510._0_4_ = uVar11;
            auVar127 = ZEXT3264(local_6e0);
            goto LAB_016f5eb5;
          }
        }
        auVar173 = ZEXT3264(local_780);
        uVar87 = 0;
        auVar188 = ZEXT3264(local_680);
        auVar182 = ZEXT3264(local_6c0);
        auVar127 = ZEXT3264(local_6e0);
      }
LAB_016f5eb5:
      auVar206 = ZEXT464((uint)fVar129);
      if (8 < iVar12) {
        local_460._4_4_ = iVar12;
        local_460._0_4_ = iVar12;
        local_460._8_4_ = iVar12;
        local_460._12_4_ = iVar12;
        local_460._16_4_ = iVar12;
        local_460._20_4_ = iVar12;
        local_460._24_4_ = iVar12;
        local_460._28_4_ = iVar12;
        local_480._4_4_ = fVar129;
        local_480._0_4_ = fVar129;
        uStack_478._0_4_ = fVar129;
        uStack_478._4_4_ = fVar129;
        auStack_470._0_4_ = fVar129;
        auStack_470._4_4_ = fVar129;
        fStack_468 = fVar129;
        fStack_464 = fVar129;
        local_100 = local_7a0._0_4_;
        uStack_fc = local_7a0._0_4_;
        uStack_f8 = local_7a0._0_4_;
        uStack_f4 = local_7a0._0_4_;
        uStack_f0 = local_7a0._0_4_;
        uStack_ec = local_7a0._0_4_;
        uStack_e8 = local_7a0._0_4_;
        uStack_e4 = local_7a0._0_4_;
        local_120 = 1.0 / (float)local_420._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        local_310 = (undefined4)local_7a8;
        uStack_30c = (undefined4)local_7a8;
        uStack_308 = (undefined4)local_7a8;
        uStack_304 = (undefined4)local_7a8;
        local_510 = CONCAT44((uint)local_510,(uint)local_510);
        uStack_508 = (uint)local_510;
        uStack_504 = (uint)local_510;
        lVar88 = 8;
        local_780 = auVar173._0_32_;
        local_6a0 = auVar220;
        local_5a0 = uVar91;
        do {
          auVar154 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar25);
          auVar9 = *(undefined1 (*) [32])(lVar25 + 0x2227768 + lVar88 * 4);
          auVar165 = *(undefined1 (*) [32])(lVar25 + 0x2227bec + lVar88 * 4);
          pauVar5 = (undefined1 (*) [28])(lVar25 + 0x2228070 + lVar88 * 4);
          fVar105 = *(float *)*pauVar5;
          fVar107 = *(float *)(*pauVar5 + 4);
          fVar109 = *(float *)(*pauVar5 + 8);
          fVar110 = *(float *)(*pauVar5 + 0xc);
          fVar111 = *(float *)(*pauVar5 + 0x10);
          fVar112 = *(float *)(*pauVar5 + 0x14);
          fVar197 = *(float *)(*pauVar5 + 0x18);
          auVar79 = *pauVar5;
          auVar205._0_4_ = auVar177._0_4_ * fVar105;
          auVar205._4_4_ = auVar177._4_4_ * fVar107;
          auVar205._8_4_ = auVar177._8_4_ * fVar109;
          auVar205._12_4_ = auVar177._12_4_ * fVar110;
          auVar205._16_4_ = auVar177._16_4_ * fVar111;
          auVar205._20_4_ = auVar177._20_4_ * fVar112;
          auVar205._28_36_ = auVar206._28_36_;
          auVar205._24_4_ = auVar177._24_4_ * fVar197;
          auVar206._0_4_ = fVar219 * fVar105;
          auVar206._4_4_ = fVar221 * fVar107;
          auVar206._8_4_ = fVar104 * fVar109;
          auVar206._12_4_ = fVar106 * fVar110;
          auVar206._16_4_ = fVar108 * fVar111;
          auVar206._20_4_ = fVar146 * fVar112;
          auVar206._28_36_ = auVar142._28_36_;
          auVar206._24_4_ = fVar147 * fVar197;
          auVar16 = vfmadd231ps_fma(auVar205._0_32_,auVar165,auVar182._0_32_);
          auVar98 = auVar188._0_32_;
          auVar17 = vfmadd231ps_fma(auVar206._0_32_,auVar165,auVar98);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar9,auVar212._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar9,auVar127._0_32_);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar154,auVar193._0_32_);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar154,local_440);
          auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar25);
          auVar123 = *(undefined1 (*) [32])(lVar25 + 0x2229b88 + lVar88 * 4);
          auVar161 = *(undefined1 (*) [32])(lVar25 + 0x222a00c + lVar88 * 4);
          pfVar6 = (float *)(lVar25 + 0x222a490 + lVar88 * 4);
          fVar201 = *pfVar6;
          fVar207 = pfVar6[1];
          fVar213 = pfVar6[2];
          fVar214 = pfVar6[3];
          fVar215 = pfVar6[4];
          fVar216 = pfVar6[5];
          fVar217 = pfVar6[6];
          auVar142._0_4_ = fVar201 * auVar177._0_4_;
          auVar142._4_4_ = fVar207 * auVar177._4_4_;
          auVar142._8_4_ = fVar213 * auVar177._8_4_;
          auVar142._12_4_ = fVar214 * auVar177._12_4_;
          auVar142._16_4_ = fVar215 * auVar177._16_4_;
          auVar142._20_4_ = fVar216 * auVar177._20_4_;
          auVar142._28_36_ = auVar177._28_36_;
          auVar142._24_4_ = fVar217 * auVar177._24_4_;
          auVar24._4_4_ = fVar207 * fVar221;
          auVar24._0_4_ = fVar201 * fVar219;
          auVar24._8_4_ = fVar213 * fVar104;
          auVar24._12_4_ = fVar214 * fVar106;
          auVar24._16_4_ = fVar215 * fVar108;
          auVar24._20_4_ = fVar216 * fVar146;
          auVar24._24_4_ = fVar217 * fVar147;
          auVar24._28_4_ = auVar154._28_4_;
          auVar19 = vfmadd231ps_fma(auVar142._0_32_,auVar161,auVar182._0_32_);
          auVar20 = vfmadd231ps_fma(auVar24,auVar161,auVar98);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar123,auVar212._0_32_);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar123,auVar127._0_32_);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar97,auVar193._0_32_);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar97,local_440);
          auVar100 = ZEXT1632(auVar16);
          auVar18 = vsubps_avx(ZEXT1632(auVar19),auVar100);
          auVar171 = ZEXT1632(auVar20);
          auVar140 = ZEXT1632(auVar17);
          auVar23 = vsubps_avx(auVar171,auVar140);
          auVar42._4_4_ = auVar18._4_4_ * auVar17._4_4_;
          auVar42._0_4_ = auVar18._0_4_ * auVar17._0_4_;
          auVar42._8_4_ = auVar18._8_4_ * auVar17._8_4_;
          auVar42._12_4_ = auVar18._12_4_ * auVar17._12_4_;
          auVar42._16_4_ = auVar18._16_4_ * 0.0;
          auVar42._20_4_ = auVar18._20_4_ * 0.0;
          auVar42._24_4_ = auVar18._24_4_ * 0.0;
          auVar42._28_4_ = auVar182._28_4_;
          fVar129 = auVar23._0_4_;
          auVar173._0_4_ = auVar16._0_4_ * fVar129;
          fVar104 = auVar23._4_4_;
          auVar173._4_4_ = auVar16._4_4_ * fVar104;
          fVar106 = auVar23._8_4_;
          auVar173._8_4_ = auVar16._8_4_ * fVar106;
          fVar108 = auVar23._12_4_;
          auVar173._12_4_ = auVar16._12_4_ * fVar108;
          fVar146 = auVar23._16_4_;
          auVar173._16_4_ = fVar146 * 0.0;
          fVar147 = auVar23._20_4_;
          auVar173._20_4_ = fVar147 * 0.0;
          fVar128 = auVar23._24_4_;
          auVar173._28_36_ = auVar127._28_36_;
          auVar173._24_4_ = fVar128 * 0.0;
          auVar24 = vsubps_avx(auVar42,auVar173._0_32_);
          auVar43._4_4_ = local_e0._4_4_ * fVar107;
          auVar43._0_4_ = (float)local_e0 * fVar105;
          auVar43._8_4_ = (float)uStack_d8 * fVar109;
          auVar43._12_4_ = uStack_d8._4_4_ * fVar110;
          auVar43._16_4_ = (float)uStack_d0 * fVar111;
          auVar43._20_4_ = uStack_d0._4_4_ * fVar112;
          auVar43._24_4_ = (float)uStack_c8 * fVar197;
          auVar43._28_4_ = auVar127._28_4_;
          auVar16 = vfmadd231ps_fma(auVar43,local_c0,auVar165);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_a0,auVar9);
          auVar142 = ZEXT3264(local_80);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_80,auVar154);
          auVar44._4_4_ = local_e0._4_4_ * fVar207;
          auVar44._0_4_ = (float)local_e0 * fVar201;
          auVar44._8_4_ = (float)uStack_d8 * fVar213;
          auVar44._12_4_ = uStack_d8._4_4_ * fVar214;
          auVar44._16_4_ = (float)uStack_d0 * fVar215;
          auVar44._20_4_ = uStack_d0._4_4_ * fVar216;
          auVar44._24_4_ = (float)uStack_c8 * fVar217;
          auVar44._28_4_ = uStack_c8._4_4_;
          auVar21 = vfmadd231ps_fma(auVar44,auVar161,local_c0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar123,local_a0);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar97,local_80);
          auVar206 = ZEXT1664(auVar21);
          auVar193._0_4_ = fVar129 * fVar129;
          auVar193._4_4_ = fVar104 * fVar104;
          auVar193._8_4_ = fVar106 * fVar106;
          auVar193._12_4_ = fVar108 * fVar108;
          auVar193._16_4_ = fVar146 * fVar146;
          auVar193._20_4_ = fVar147 * fVar147;
          auVar193._28_36_ = auVar188._28_36_;
          auVar193._24_4_ = fVar128 * fVar128;
          auVar22 = vfmadd231ps_fma(auVar193._0_32_,auVar18,auVar18);
          auVar125 = ZEXT1632(auVar16);
          local_7a0 = ZEXT1632(auVar21);
          auVar187 = vmaxps_avx(auVar125,local_7a0);
          auVar184._0_4_ = auVar187._0_4_ * auVar187._0_4_ * auVar22._0_4_;
          auVar184._4_4_ = auVar187._4_4_ * auVar187._4_4_ * auVar22._4_4_;
          auVar184._8_4_ = auVar187._8_4_ * auVar187._8_4_ * auVar22._8_4_;
          auVar184._12_4_ = auVar187._12_4_ * auVar187._12_4_ * auVar22._12_4_;
          auVar184._16_4_ = auVar187._16_4_ * auVar187._16_4_ * 0.0;
          auVar184._20_4_ = auVar187._20_4_ * auVar187._20_4_ * 0.0;
          auVar184._24_4_ = auVar187._24_4_ * auVar187._24_4_ * 0.0;
          auVar184._28_4_ = 0;
          auVar45._4_4_ = auVar24._4_4_ * auVar24._4_4_;
          auVar45._0_4_ = auVar24._0_4_ * auVar24._0_4_;
          auVar45._8_4_ = auVar24._8_4_ * auVar24._8_4_;
          auVar45._12_4_ = auVar24._12_4_ * auVar24._12_4_;
          auVar45._16_4_ = auVar24._16_4_ * auVar24._16_4_;
          auVar45._20_4_ = auVar24._20_4_ * auVar24._20_4_;
          auVar45._24_4_ = auVar24._24_4_ * auVar24._24_4_;
          auVar45._28_4_ = auVar24._28_4_;
          auVar187 = vcmpps_avx(auVar45,auVar184,2);
          local_280 = (int)lVar88;
          auVar185._4_4_ = local_280;
          auVar185._0_4_ = local_280;
          auVar185._8_4_ = local_280;
          auVar185._12_4_ = local_280;
          auVar185._16_4_ = local_280;
          auVar185._20_4_ = local_280;
          auVar185._24_4_ = local_280;
          auVar185._28_4_ = local_280;
          auVar24 = vpor_avx2(auVar185,_DAT_0205a920);
          auVar99 = vpcmpgtd_avx2(local_460,auVar24);
          auVar24 = auVar99 & auVar187;
          fVar219 = (float)local_720;
          fVar221 = local_720._4_4_;
          fVar104 = (float)uStack_718;
          fVar106 = uStack_718._4_4_;
          fVar108 = (float)uStack_710;
          fVar146 = uStack_710._4_4_;
          fVar147 = (float)uStack_708;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0x7f,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0xbf,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar24[0x1f]) {
            auVar127 = ZEXT3264(local_6e0);
            auVar182 = ZEXT3264(local_6c0);
            auVar188 = ZEXT3264(auVar98);
            auVar177 = ZEXT3264(CONCAT428(fStack_644,
                                          CONCAT424(fStack_648,
                                                    CONCAT420(fStack_64c,
                                                              CONCAT416(fStack_650,
                                                                        CONCAT412(fStack_654,
                                                                                  CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            auVar212 = ZEXT3264(local_740);
            auVar193 = ZEXT3264(local_760);
            auVar173 = ZEXT3264(local_780);
            local_7a0 = auVar165;
          }
          else {
            auVar24 = vandps_avx(auVar99,auVar187);
            auVar46._4_4_ = fVar207 * local_5a0._4_4_;
            auVar46._0_4_ = fVar201 * (float)local_5a0;
            auVar46._8_4_ = fVar213 * (float)uStack_598;
            auVar46._12_4_ = fVar214 * uStack_598._4_4_;
            auVar46._16_4_ = fVar215 * (float)uStack_590;
            auVar46._20_4_ = fVar216 * uStack_590._4_4_;
            auVar46._24_4_ = fVar217 * (float)uStack_588;
            auVar46._28_4_ = auVar187._28_4_;
            auVar16 = vfmadd213ps_fma(auVar161,local_140,auVar46);
            auVar16 = vfmadd213ps_fma(auVar123,local_6a0,ZEXT1632(auVar16));
            auVar16 = vfmadd132ps_fma(auVar97,ZEXT1632(auVar16),local_4a0);
            local_560._0_4_ = auVar79._0_4_;
            local_560._4_4_ = auVar79._4_4_;
            uStack_558._0_4_ = auVar79._8_4_;
            uStack_558._4_4_ = auVar79._12_4_;
            auStack_550._0_4_ = auVar79._16_4_;
            auStack_550._4_4_ = auVar79._20_4_;
            fStack_548 = auVar79._24_4_;
            auVar47._4_4_ = local_5a0._4_4_ * (float)local_560._4_4_;
            auVar47._0_4_ = (float)local_5a0 * (float)local_560._0_4_;
            auVar47._8_4_ = (float)uStack_598 * (float)uStack_558;
            auVar47._12_4_ = uStack_598._4_4_ * uStack_558._4_4_;
            auVar47._16_4_ = (float)uStack_590 * (float)auStack_550._0_4_;
            auVar47._20_4_ = uStack_590._4_4_ * (float)auStack_550._4_4_;
            auVar47._24_4_ = (float)uStack_588 * fStack_548;
            auVar47._28_4_ = auVar187._28_4_;
            auVar22 = vfmadd213ps_fma(auVar165,local_140,auVar47);
            auVar22 = vfmadd213ps_fma(auVar9,local_6a0,ZEXT1632(auVar22));
            auVar9 = *(undefined1 (*) [32])(lVar25 + 0x22284f4 + lVar88 * 4);
            auVar165 = *(undefined1 (*) [32])(lVar25 + 0x2228978 + lVar88 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar25 + 0x2228dfc + lVar88 * 4);
            pfVar6 = (float *)(lVar25 + 0x2229280 + lVar88 * 4);
            fVar129 = *pfVar6;
            fVar128 = pfVar6[1];
            fVar105 = pfVar6[2];
            fVar107 = pfVar6[3];
            fVar109 = pfVar6[4];
            fVar110 = pfVar6[5];
            fVar111 = pfVar6[6];
            auVar48._4_4_ = fVar128 * fStack_65c;
            auVar48._0_4_ = fVar129 * local_660;
            auVar48._8_4_ = fVar105 * fStack_658;
            auVar48._12_4_ = fVar107 * fStack_654;
            auVar48._16_4_ = fVar109 * fStack_650;
            auVar48._20_4_ = fVar110 * fStack_64c;
            auVar48._24_4_ = fVar111 * fStack_648;
            auVar48._28_4_ = local_6a0._28_4_;
            auVar199._0_4_ = fVar129 * (float)local_720;
            auVar199._4_4_ = fVar128 * local_720._4_4_;
            auVar199._8_4_ = fVar105 * (float)uStack_718;
            auVar199._12_4_ = fVar107 * uStack_718._4_4_;
            auVar199._16_4_ = fVar109 * (float)uStack_710;
            auVar199._20_4_ = fVar110 * uStack_710._4_4_;
            auVar199._24_4_ = fVar111 * (float)uStack_708;
            auVar199._28_4_ = 0;
            auVar49._4_4_ = fVar128 * local_5a0._4_4_;
            auVar49._0_4_ = fVar129 * (float)local_5a0;
            auVar49._8_4_ = fVar105 * (float)uStack_598;
            auVar49._12_4_ = fVar107 * uStack_598._4_4_;
            auVar49._16_4_ = fVar109 * (float)uStack_590;
            auVar49._20_4_ = fVar110 * uStack_590._4_4_;
            auVar49._24_4_ = fVar111 * (float)uStack_588;
            auVar49._28_4_ = pfVar6[7];
            auVar95 = vfmadd231ps_fma(auVar48,auVar97,local_6c0);
            auVar94 = vfmadd231ps_fma(auVar199,auVar97,auVar98);
            auVar115 = vfmadd231ps_fma(auVar49,local_140,auVar97);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar165,local_740);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar165,local_6e0);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_6a0,auVar165);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar9,local_760);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar9,local_440);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar9,local_4a0);
            pfVar6 = (float *)(lVar25 + 0x222b6a0 + lVar88 * 4);
            fVar129 = *pfVar6;
            fVar128 = pfVar6[1];
            fVar105 = pfVar6[2];
            fVar107 = pfVar6[3];
            fVar109 = pfVar6[4];
            fVar110 = pfVar6[5];
            fVar111 = pfVar6[6];
            auVar50._4_4_ = fStack_65c * fVar128;
            auVar50._0_4_ = local_660 * fVar129;
            auVar50._8_4_ = fStack_658 * fVar105;
            auVar50._12_4_ = fStack_654 * fVar107;
            auVar50._16_4_ = fStack_650 * fVar109;
            auVar50._20_4_ = fStack_64c * fVar110;
            auVar50._24_4_ = fStack_648 * fVar111;
            auVar50._28_4_ = auVar18._28_4_;
            auVar51._4_4_ = local_720._4_4_ * fVar128;
            auVar51._0_4_ = (float)local_720 * fVar129;
            auVar51._8_4_ = (float)uStack_718 * fVar105;
            auVar51._12_4_ = uStack_718._4_4_ * fVar107;
            auVar51._16_4_ = (float)uStack_710 * fVar109;
            auVar51._20_4_ = uStack_710._4_4_ * fVar110;
            auVar51._24_4_ = (float)uStack_708 * fVar111;
            auVar51._28_4_ = auVar23._28_4_;
            auVar52._4_4_ = fVar128 * local_5a0._4_4_;
            auVar52._0_4_ = fVar129 * (float)local_5a0;
            auVar52._8_4_ = fVar105 * (float)uStack_598;
            auVar52._12_4_ = fVar107 * uStack_598._4_4_;
            auVar52._16_4_ = fVar109 * (float)uStack_590;
            auVar52._20_4_ = fVar110 * uStack_590._4_4_;
            auVar52._24_4_ = fVar111 * (float)uStack_588;
            auVar52._28_4_ = pfVar6[7];
            auVar9 = *(undefined1 (*) [32])(lVar25 + 0x222b21c + lVar88 * 4);
            auVar114 = vfmadd231ps_fma(auVar50,auVar9,local_6c0);
            auVar93 = vfmadd231ps_fma(auVar51,auVar9,local_680);
            auVar130 = vfmadd231ps_fma(auVar52,local_140,auVar9);
            auVar9 = *(undefined1 (*) [32])(lVar25 + 0x222ad98 + lVar88 * 4);
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar9,local_740);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar9,local_6e0);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),auVar9,local_6a0);
            auVar9 = *(undefined1 (*) [32])(lVar25 + 0x222a914 + lVar88 * 4);
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar9,local_760);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar9,local_440);
            auVar130 = vfmadd231ps_fma(ZEXT1632(auVar130),local_4a0,auVar9);
            auVar186._8_4_ = 0x7fffffff;
            auVar186._0_8_ = 0x7fffffff7fffffff;
            auVar186._12_4_ = 0x7fffffff;
            auVar186._16_4_ = 0x7fffffff;
            auVar186._20_4_ = 0x7fffffff;
            auVar186._24_4_ = 0x7fffffff;
            auVar186._28_4_ = 0x7fffffff;
            auVar9 = vandps_avx(ZEXT1632(auVar95),auVar186);
            auVar165 = vandps_avx(ZEXT1632(auVar94),auVar186);
            auVar165 = vmaxps_avx(auVar9,auVar165);
            auVar9 = vandps_avx(ZEXT1632(auVar115),auVar186);
            auVar9 = vmaxps_avx(auVar165,auVar9);
            auVar9 = vcmpps_avx(auVar9,_local_480,1);
            auVar97 = vblendvps_avx(ZEXT1632(auVar95),auVar18,auVar9);
            auVar123 = vblendvps_avx(ZEXT1632(auVar94),auVar23,auVar9);
            auVar9 = vandps_avx(ZEXT1632(auVar114),auVar186);
            auVar165 = vandps_avx(ZEXT1632(auVar93),auVar186);
            auVar165 = vmaxps_avx(auVar9,auVar165);
            auVar9 = vandps_avx(auVar186,ZEXT1632(auVar130));
            auVar9 = vmaxps_avx(auVar165,auVar9);
            auVar165 = vcmpps_avx(auVar9,_local_480,1);
            auVar9 = vblendvps_avx(ZEXT1632(auVar114),auVar18,auVar165);
            auVar165 = vblendvps_avx(ZEXT1632(auVar93),auVar23,auVar165);
            auVar22 = vfmadd213ps_fma(auVar154,local_4a0,ZEXT1632(auVar22));
            auVar95 = vfmadd213ps_fma(auVar97,auVar97,ZEXT832(0) << 0x20);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar123,auVar123);
            auVar154 = vrsqrtps_avx(ZEXT1632(auVar95));
            fVar129 = auVar154._0_4_;
            fVar128 = auVar154._4_4_;
            fVar105 = auVar154._8_4_;
            fVar107 = auVar154._12_4_;
            fVar109 = auVar154._16_4_;
            fVar110 = auVar154._20_4_;
            fVar111 = auVar154._24_4_;
            auVar53._4_4_ = fVar128 * fVar128 * fVar128 * auVar95._4_4_ * -0.5;
            auVar53._0_4_ = fVar129 * fVar129 * fVar129 * auVar95._0_4_ * -0.5;
            auVar53._8_4_ = fVar105 * fVar105 * fVar105 * auVar95._8_4_ * -0.5;
            auVar53._12_4_ = fVar107 * fVar107 * fVar107 * auVar95._12_4_ * -0.5;
            auVar53._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar53._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar53._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar53._28_4_ = 0;
            auVar211._8_4_ = 0x3fc00000;
            auVar211._0_8_ = 0x3fc000003fc00000;
            auVar211._12_4_ = 0x3fc00000;
            auVar211._16_4_ = 0x3fc00000;
            auVar211._20_4_ = 0x3fc00000;
            auVar211._24_4_ = 0x3fc00000;
            auVar211._28_4_ = 0x3fc00000;
            auVar95 = vfmadd231ps_fma(auVar53,auVar211,auVar154);
            fVar129 = auVar95._0_4_;
            fVar128 = auVar95._4_4_;
            auVar54._4_4_ = auVar123._4_4_ * fVar128;
            auVar54._0_4_ = auVar123._0_4_ * fVar129;
            fVar105 = auVar95._8_4_;
            auVar54._8_4_ = auVar123._8_4_ * fVar105;
            fVar107 = auVar95._12_4_;
            auVar54._12_4_ = auVar123._12_4_ * fVar107;
            auVar54._16_4_ = auVar123._16_4_ * 0.0;
            auVar54._20_4_ = auVar123._20_4_ * 0.0;
            auVar54._24_4_ = auVar123._24_4_ * 0.0;
            auVar54._28_4_ = auVar154._28_4_;
            auVar55._4_4_ = fVar128 * -auVar97._4_4_;
            auVar55._0_4_ = fVar129 * -auVar97._0_4_;
            auVar55._8_4_ = fVar105 * -auVar97._8_4_;
            auVar55._12_4_ = fVar107 * -auVar97._12_4_;
            auVar55._16_4_ = -auVar97._16_4_ * 0.0;
            auVar55._20_4_ = -auVar97._20_4_ * 0.0;
            auVar55._24_4_ = -auVar97._24_4_ * 0.0;
            auVar55._28_4_ = auVar123._28_4_;
            auVar95 = vfmadd213ps_fma(auVar9,auVar9,ZEXT832(0) << 0x20);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar165,auVar165);
            auVar154 = vrsqrtps_avx(ZEXT1632(auVar95));
            auVar56._28_4_ = local_6c0._28_4_;
            auVar56._0_28_ =
                 ZEXT1628(CONCAT412(fVar107 * 0.0,
                                    CONCAT48(fVar105 * 0.0,CONCAT44(fVar128 * 0.0,fVar129 * 0.0))));
            fVar129 = auVar154._0_4_;
            fVar128 = auVar154._4_4_;
            fVar105 = auVar154._8_4_;
            fVar107 = auVar154._12_4_;
            fVar109 = auVar154._16_4_;
            fVar110 = auVar154._20_4_;
            fVar111 = auVar154._24_4_;
            auVar57._4_4_ = fVar128 * fVar128 * fVar128 * auVar95._4_4_ * -0.5;
            auVar57._0_4_ = fVar129 * fVar129 * fVar129 * auVar95._0_4_ * -0.5;
            auVar57._8_4_ = fVar105 * fVar105 * fVar105 * auVar95._8_4_ * -0.5;
            auVar57._12_4_ = fVar107 * fVar107 * fVar107 * auVar95._12_4_ * -0.5;
            auVar57._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
            auVar57._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
            auVar57._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
            auVar57._28_4_ = 0;
            auVar95 = vfmadd231ps_fma(auVar57,auVar211,auVar154);
            fVar129 = auVar95._0_4_;
            fVar128 = auVar95._4_4_;
            auVar58._4_4_ = auVar165._4_4_ * fVar128;
            auVar58._0_4_ = auVar165._0_4_ * fVar129;
            fVar105 = auVar95._8_4_;
            auVar58._8_4_ = auVar165._8_4_ * fVar105;
            fVar107 = auVar95._12_4_;
            auVar58._12_4_ = auVar165._12_4_ * fVar107;
            auVar58._16_4_ = auVar165._16_4_ * 0.0;
            auVar58._20_4_ = auVar165._20_4_ * 0.0;
            auVar58._24_4_ = auVar165._24_4_ * 0.0;
            auVar58._28_4_ = 0;
            auVar59._4_4_ = fVar128 * -auVar9._4_4_;
            auVar59._0_4_ = fVar129 * -auVar9._0_4_;
            auVar59._8_4_ = fVar105 * -auVar9._8_4_;
            auVar59._12_4_ = fVar107 * -auVar9._12_4_;
            auVar59._16_4_ = -auVar9._16_4_ * 0.0;
            auVar59._20_4_ = -auVar9._20_4_ * 0.0;
            auVar59._24_4_ = -auVar9._24_4_ * 0.0;
            auVar59._28_4_ = auVar154._28_4_;
            auVar60._28_4_ = 0xbf000000;
            auVar60._0_28_ =
                 ZEXT1628(CONCAT412(fVar107 * 0.0,
                                    CONCAT48(fVar105 * 0.0,CONCAT44(fVar128 * 0.0,fVar129 * 0.0))));
            auVar95 = vfmadd213ps_fma(auVar54,auVar125,auVar100);
            auVar94 = vfmadd213ps_fma(auVar55,auVar125,auVar140);
            auVar115 = vfmadd213ps_fma(auVar56,auVar125,ZEXT1632(auVar22));
            auVar130 = vfnmadd213ps_fma(auVar54,auVar125,auVar100);
            auVar114 = vfmadd213ps_fma(auVar58,local_7a0,ZEXT1632(auVar19));
            auVar143 = vfnmadd213ps_fma(auVar55,auVar125,auVar140);
            auVar93 = vfmadd213ps_fma(auVar59,local_7a0,auVar171);
            auVar113 = vfnmadd231ps_fma(ZEXT1632(auVar22),auVar125,auVar56);
            auVar22 = vfmadd213ps_fma(auVar60,local_7a0,ZEXT1632(auVar16));
            auVar149 = vfnmadd213ps_fma(auVar58,local_7a0,ZEXT1632(auVar19));
            auVar92 = vfnmadd213ps_fma(auVar59,local_7a0,auVar171);
            auVar148 = vfnmadd231ps_fma(ZEXT1632(auVar16),local_7a0,auVar60);
            auVar154 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar143));
            auVar9 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar113));
            auVar61._4_4_ = auVar154._4_4_ * auVar113._4_4_;
            auVar61._0_4_ = auVar154._0_4_ * auVar113._0_4_;
            auVar61._8_4_ = auVar154._8_4_ * auVar113._8_4_;
            auVar61._12_4_ = auVar154._12_4_ * auVar113._12_4_;
            auVar61._16_4_ = auVar154._16_4_ * 0.0;
            auVar61._20_4_ = auVar154._20_4_ * 0.0;
            auVar61._24_4_ = auVar154._24_4_ * 0.0;
            auVar61._28_4_ = 0;
            auVar19 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar143),auVar9);
            auVar62._4_4_ = auVar130._4_4_ * auVar9._4_4_;
            auVar62._0_4_ = auVar130._0_4_ * auVar9._0_4_;
            auVar62._8_4_ = auVar130._8_4_ * auVar9._8_4_;
            auVar62._12_4_ = auVar130._12_4_ * auVar9._12_4_;
            auVar62._16_4_ = auVar9._16_4_ * 0.0;
            auVar62._20_4_ = auVar9._20_4_ * 0.0;
            auVar62._24_4_ = auVar9._24_4_ * 0.0;
            auVar62._28_4_ = auVar9._28_4_;
            auVar187 = ZEXT1632(auVar130);
            auVar9 = vsubps_avx(ZEXT1632(auVar114),auVar187);
            auVar140 = ZEXT1632(auVar113);
            auVar16 = vfmsub231ps_fma(auVar62,auVar140,auVar9);
            auVar63._4_4_ = auVar143._4_4_ * auVar9._4_4_;
            auVar63._0_4_ = auVar143._0_4_ * auVar9._0_4_;
            auVar63._8_4_ = auVar143._8_4_ * auVar9._8_4_;
            auVar63._12_4_ = auVar143._12_4_ * auVar9._12_4_;
            auVar63._16_4_ = auVar9._16_4_ * 0.0;
            auVar63._20_4_ = auVar9._20_4_ * 0.0;
            auVar63._24_4_ = auVar9._24_4_ * 0.0;
            auVar63._28_4_ = auVar9._28_4_;
            auVar130 = vfmsub231ps_fma(auVar63,auVar187,auVar154);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar130),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
            auVar171 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,2);
            auVar154 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar95),auVar171);
            auVar9 = vblendvps_avx(ZEXT1632(auVar92),ZEXT1632(auVar94),auVar171);
            auVar165 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar115),auVar171);
            auVar97 = vblendvps_avx(auVar187,ZEXT1632(auVar114),auVar171);
            auVar123 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar93),auVar171);
            auVar161 = vblendvps_avx(auVar140,ZEXT1632(auVar22),auVar171);
            auVar187 = vblendvps_avx(ZEXT1632(auVar114),auVar187,auVar171);
            auVar99 = vblendvps_avx(ZEXT1632(auVar93),ZEXT1632(auVar143),auVar171);
            auVar16 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
            auVar140 = vblendvps_avx(ZEXT1632(auVar22),auVar140,auVar171);
            auVar187 = vsubps_avx(auVar187,auVar154);
            auVar99 = vsubps_avx(auVar99,auVar9);
            auVar98 = vsubps_avx(auVar140,auVar165);
            auVar100 = vsubps_avx(auVar154,auVar97);
            auVar118 = vsubps_avx(auVar9,auVar123);
            auVar119 = vsubps_avx(auVar165,auVar161);
            auVar162._0_4_ = auVar98._0_4_ * auVar154._0_4_;
            auVar162._4_4_ = auVar98._4_4_ * auVar154._4_4_;
            auVar162._8_4_ = auVar98._8_4_ * auVar154._8_4_;
            auVar162._12_4_ = auVar98._12_4_ * auVar154._12_4_;
            auVar162._16_4_ = auVar98._16_4_ * auVar154._16_4_;
            auVar162._20_4_ = auVar98._20_4_ * auVar154._20_4_;
            auVar162._24_4_ = auVar98._24_4_ * auVar154._24_4_;
            auVar162._28_4_ = 0;
            auVar19 = vfmsub231ps_fma(auVar162,auVar165,auVar187);
            auVar64._4_4_ = auVar187._4_4_ * auVar9._4_4_;
            auVar64._0_4_ = auVar187._0_4_ * auVar9._0_4_;
            auVar64._8_4_ = auVar187._8_4_ * auVar9._8_4_;
            auVar64._12_4_ = auVar187._12_4_ * auVar9._12_4_;
            auVar64._16_4_ = auVar187._16_4_ * auVar9._16_4_;
            auVar64._20_4_ = auVar187._20_4_ * auVar9._20_4_;
            auVar64._24_4_ = auVar187._24_4_ * auVar9._24_4_;
            auVar64._28_4_ = auVar140._28_4_;
            auVar22 = vfmsub231ps_fma(auVar64,auVar154,auVar99);
            auVar140 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar140,ZEXT1632(auVar19));
            auVar163._0_4_ = auVar99._0_4_ * auVar165._0_4_;
            auVar163._4_4_ = auVar99._4_4_ * auVar165._4_4_;
            auVar163._8_4_ = auVar99._8_4_ * auVar165._8_4_;
            auVar163._12_4_ = auVar99._12_4_ * auVar165._12_4_;
            auVar163._16_4_ = auVar99._16_4_ * auVar165._16_4_;
            auVar163._20_4_ = auVar99._20_4_ * auVar165._20_4_;
            auVar163._24_4_ = auVar99._24_4_ * auVar165._24_4_;
            auVar163._28_4_ = 0;
            auVar22 = vfmsub231ps_fma(auVar163,auVar9,auVar98);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar140,ZEXT1632(auVar22));
            auVar142 = ZEXT1664(auVar22);
            auVar164._0_4_ = auVar119._0_4_ * auVar97._0_4_;
            auVar164._4_4_ = auVar119._4_4_ * auVar97._4_4_;
            auVar164._8_4_ = auVar119._8_4_ * auVar97._8_4_;
            auVar164._12_4_ = auVar119._12_4_ * auVar97._12_4_;
            auVar164._16_4_ = auVar119._16_4_ * auVar97._16_4_;
            auVar164._20_4_ = auVar119._20_4_ * auVar97._20_4_;
            auVar164._24_4_ = auVar119._24_4_ * auVar97._24_4_;
            auVar164._28_4_ = 0;
            auVar19 = vfmsub231ps_fma(auVar164,auVar100,auVar161);
            auVar65._4_4_ = auVar118._4_4_ * auVar161._4_4_;
            auVar65._0_4_ = auVar118._0_4_ * auVar161._0_4_;
            auVar65._8_4_ = auVar118._8_4_ * auVar161._8_4_;
            auVar65._12_4_ = auVar118._12_4_ * auVar161._12_4_;
            auVar65._16_4_ = auVar118._16_4_ * auVar161._16_4_;
            auVar65._20_4_ = auVar118._20_4_ * auVar161._20_4_;
            auVar65._24_4_ = auVar118._24_4_ * auVar161._24_4_;
            auVar65._28_4_ = auVar161._28_4_;
            auVar95 = vfmsub231ps_fma(auVar65,auVar123,auVar119);
            auVar66._4_4_ = auVar100._4_4_ * auVar123._4_4_;
            auVar66._0_4_ = auVar100._0_4_ * auVar123._0_4_;
            auVar66._8_4_ = auVar100._8_4_ * auVar123._8_4_;
            auVar66._12_4_ = auVar100._12_4_ * auVar123._12_4_;
            auVar66._16_4_ = auVar100._16_4_ * auVar123._16_4_;
            auVar66._20_4_ = auVar100._20_4_ * auVar123._20_4_;
            auVar66._24_4_ = auVar100._24_4_ * auVar123._24_4_;
            auVar66._28_4_ = auVar123._28_4_;
            auVar94 = vfmsub231ps_fma(auVar66,auVar118,auVar97);
            auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar97,ZEXT1632(auVar19));
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar97,ZEXT1632(auVar95));
            auVar97 = vmaxps_avx(ZEXT1632(auVar22),ZEXT1632(auVar95));
            auVar97 = vcmpps_avx(auVar97,ZEXT832(0) << 0x20,2);
            auVar19 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
            auVar19 = vpand_avx(auVar19,auVar16);
            auVar97 = vpmovsxwd_avx2(auVar19);
            if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0x7f,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0xbf,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar97[0x1f]) {
LAB_016f7319:
              auVar145._8_8_ = uStack_4b8;
              auVar145._0_8_ = local_4c0;
              auVar145._16_8_ = uStack_4b0;
              auVar145._24_8_ = uStack_4a8;
            }
            else {
              auVar67._4_4_ = auVar99._4_4_ * auVar119._4_4_;
              auVar67._0_4_ = auVar99._0_4_ * auVar119._0_4_;
              auVar67._8_4_ = auVar99._8_4_ * auVar119._8_4_;
              auVar67._12_4_ = auVar99._12_4_ * auVar119._12_4_;
              auVar67._16_4_ = auVar99._16_4_ * auVar119._16_4_;
              auVar67._20_4_ = auVar99._20_4_ * auVar119._20_4_;
              auVar67._24_4_ = auVar99._24_4_ * auVar119._24_4_;
              auVar67._28_4_ = auVar97._28_4_;
              auVar93 = vfmsub231ps_fma(auVar67,auVar118,auVar98);
              auVar172._0_4_ = auVar98._0_4_ * auVar100._0_4_;
              auVar172._4_4_ = auVar98._4_4_ * auVar100._4_4_;
              auVar172._8_4_ = auVar98._8_4_ * auVar100._8_4_;
              auVar172._12_4_ = auVar98._12_4_ * auVar100._12_4_;
              auVar172._16_4_ = auVar98._16_4_ * auVar100._16_4_;
              auVar172._20_4_ = auVar98._20_4_ * auVar100._20_4_;
              auVar172._24_4_ = auVar98._24_4_ * auVar100._24_4_;
              auVar172._28_4_ = 0;
              auVar114 = vfmsub231ps_fma(auVar172,auVar187,auVar119);
              auVar68._4_4_ = auVar187._4_4_ * auVar118._4_4_;
              auVar68._0_4_ = auVar187._0_4_ * auVar118._0_4_;
              auVar68._8_4_ = auVar187._8_4_ * auVar118._8_4_;
              auVar68._12_4_ = auVar187._12_4_ * auVar118._12_4_;
              auVar68._16_4_ = auVar187._16_4_ * auVar118._16_4_;
              auVar68._20_4_ = auVar187._20_4_ * auVar118._20_4_;
              auVar68._24_4_ = auVar187._24_4_ * auVar118._24_4_;
              auVar68._28_4_ = auVar118._28_4_;
              auVar130 = vfmsub231ps_fma(auVar68,auVar100,auVar99);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar114),ZEXT1632(auVar130));
              auVar115 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar93),ZEXT832(0) << 0x20);
              auVar97 = vrcpps_avx(ZEXT1632(auVar115));
              auVar200._8_4_ = 0x3f800000;
              auVar200._0_8_ = &DAT_3f8000003f800000;
              auVar200._12_4_ = 0x3f800000;
              auVar200._16_4_ = 0x3f800000;
              auVar200._20_4_ = 0x3f800000;
              auVar200._24_4_ = 0x3f800000;
              auVar200._28_4_ = 0x3f800000;
              auVar94 = vfnmadd213ps_fma(auVar97,ZEXT1632(auVar115),auVar200);
              auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar97,auVar97);
              auVar69._4_4_ = auVar130._4_4_ * auVar165._4_4_;
              auVar69._0_4_ = auVar130._0_4_ * auVar165._0_4_;
              auVar69._8_4_ = auVar130._8_4_ * auVar165._8_4_;
              auVar69._12_4_ = auVar130._12_4_ * auVar165._12_4_;
              auVar69._16_4_ = auVar165._16_4_ * 0.0;
              auVar69._20_4_ = auVar165._20_4_ * 0.0;
              auVar69._24_4_ = auVar165._24_4_ * 0.0;
              auVar69._28_4_ = auVar165._28_4_;
              auVar114 = vfmadd231ps_fma(auVar69,auVar9,ZEXT1632(auVar114));
              auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar154,ZEXT1632(auVar93));
              fVar129 = auVar94._0_4_;
              fVar128 = auVar94._4_4_;
              fVar105 = auVar94._8_4_;
              fVar107 = auVar94._12_4_;
              auVar165 = ZEXT1632(CONCAT412(fVar107 * auVar114._12_4_,
                                            CONCAT48(fVar105 * auVar114._8_4_,
                                                     CONCAT44(fVar128 * auVar114._4_4_,
                                                              fVar129 * auVar114._0_4_))));
              uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar144._4_4_ = uVar90;
              auVar144._0_4_ = uVar90;
              auVar144._8_4_ = uVar90;
              auVar144._12_4_ = uVar90;
              auVar144._16_4_ = uVar90;
              auVar144._20_4_ = uVar90;
              auVar144._24_4_ = uVar90;
              auVar144._28_4_ = uVar90;
              auVar78._4_4_ = uStack_fc;
              auVar78._0_4_ = local_100;
              auVar78._8_4_ = uStack_f8;
              auVar78._12_4_ = uStack_f4;
              auVar78._16_4_ = uStack_f0;
              auVar78._20_4_ = uStack_ec;
              auVar78._24_4_ = uStack_e8;
              auVar78._28_4_ = uStack_e4;
              auVar154 = vcmpps_avx(auVar78,auVar165,2);
              auVar9 = vcmpps_avx(auVar165,auVar144,2);
              auVar154 = vandps_avx(auVar9,auVar154);
              auVar94 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
              auVar19 = vpand_avx(auVar19,auVar94);
              auVar154 = vpmovsxwd_avx2(auVar19);
              if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar154 >> 0x7f,0) == '\0') &&
                    (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar154 >> 0xbf,0) == '\0') &&
                  (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar154[0x1f]) goto LAB_016f7319;
              auVar154 = vcmpps_avx(ZEXT1632(auVar115),ZEXT832(0) << 0x20,4);
              auVar94 = vpackssdw_avx(auVar154._0_16_,auVar154._16_16_);
              auVar19 = vpand_avx(auVar19,auVar94);
              auVar154 = vpmovsxwd_avx2(auVar19);
              auVar145._8_8_ = uStack_4b8;
              auVar145._0_8_ = local_4c0;
              auVar145._16_8_ = uStack_4b0;
              auVar145._24_8_ = uStack_4a8;
              if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar154 >> 0x7f,0) != '\0') ||
                    (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar154 >> 0xbf,0) != '\0') ||
                  (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar154[0x1f] < '\0') {
                auVar97 = ZEXT1632(CONCAT412(fVar107 * auVar22._12_4_,
                                             CONCAT48(fVar105 * auVar22._8_4_,
                                                      CONCAT44(fVar128 * auVar22._4_4_,
                                                               fVar129 * auVar22._0_4_))));
                auVar70._28_4_ = SUB84(uStack_4a8,4);
                auVar70._0_28_ =
                     ZEXT1628(CONCAT412(fVar107 * auVar95._12_4_,
                                        CONCAT48(fVar105 * auVar95._8_4_,
                                                 CONCAT44(fVar128 * auVar95._4_4_,
                                                          fVar129 * auVar95._0_4_))));
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = &DAT_3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar9 = vsubps_avx(auVar181,auVar97);
                _local_180 = vblendvps_avx(auVar9,auVar97,auVar171);
                auVar9 = vsubps_avx(auVar181,auVar70);
                local_360 = vblendvps_avx(auVar9,auVar70,auVar171);
                auVar142 = ZEXT3264(local_360);
                local_1a0 = auVar165;
                auVar145 = auVar154;
              }
            }
            auVar212 = ZEXT3264(local_740);
            auVar206 = ZEXT3264(local_7a0);
            auVar193 = ZEXT3264(local_760);
            local_420 = auVar23;
            if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar145 >> 0x7f,0) == '\0') &&
                  (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar145 >> 0xbf,0) == '\0') &&
                (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar145[0x1f]) {
              auVar177 = ZEXT3264(CONCAT428(fStack_644,
                                            CONCAT424(fStack_648,
                                                      CONCAT420(fStack_64c,
                                                                CONCAT416(fStack_650,
                                                                          CONCAT412(fStack_654,
                                                                                    CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
            }
            else {
              auVar154 = vsubps_avx(local_7a0,auVar125);
              auVar19 = vfmadd213ps_fma(auVar154,_local_180,auVar125);
              fVar129 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
              auVar71._4_4_ = (auVar19._4_4_ + auVar19._4_4_) * fVar129;
              auVar71._0_4_ = (auVar19._0_4_ + auVar19._0_4_) * fVar129;
              auVar71._8_4_ = (auVar19._8_4_ + auVar19._8_4_) * fVar129;
              auVar71._12_4_ = (auVar19._12_4_ + auVar19._12_4_) * fVar129;
              auVar71._16_4_ = fVar129 * 0.0;
              auVar71._20_4_ = fVar129 * 0.0;
              auVar71._24_4_ = fVar129 * 0.0;
              auVar71._28_4_ = fVar129;
              auVar154 = vcmpps_avx(local_1a0,auVar71,6);
              auVar9 = auVar145 & auVar154;
              auVar177 = ZEXT3264(CONCAT428(fStack_644,
                                            CONCAT424(fStack_648,
                                                      CONCAT420(fStack_64c,
                                                                CONCAT416(fStack_650,
                                                                          CONCAT412(fStack_654,
                                                                                    CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
              auVar182 = ZEXT3264(local_6c0);
              if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0x7f,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0xbf,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar9[0x1f] < '\0') {
                local_220 = vandps_avx(auVar154,auVar145);
                auVar126._8_4_ = 0xbf800000;
                auVar126._0_8_ = 0xbf800000bf800000;
                auVar126._12_4_ = 0xbf800000;
                auVar126._16_4_ = 0xbf800000;
                auVar126._20_4_ = 0xbf800000;
                auVar126._24_4_ = 0xbf800000;
                auVar126._28_4_ = 0xbf800000;
                auVar141._8_4_ = 0x40000000;
                auVar141._0_8_ = 0x4000000040000000;
                auVar141._12_4_ = 0x40000000;
                auVar141._16_4_ = 0x40000000;
                auVar141._20_4_ = 0x40000000;
                auVar141._24_4_ = 0x40000000;
                auVar141._28_4_ = 0x40000000;
                auVar142 = ZEXT3264(auVar141);
                auVar19 = vfmadd213ps_fma(local_360,auVar141,auVar126);
                local_2e0 = _local_180;
                local_2c0 = ZEXT1632(auVar19);
                local_2a0 = local_1a0;
                local_270 = local_6f0;
                uStack_268 = uStack_6e8;
                local_260 = local_4e0;
                uStack_258 = uStack_4d8;
                local_250 = local_4f0;
                uStack_248 = uStack_4e8;
                local_240._8_8_ = uStack_4f8;
                local_240._0_8_ = local_500;
                pGVar13 = (context->scene->geometries).items[local_7a8].ptr;
                auVar188 = ZEXT3264(local_680);
                local_360 = local_2c0;
                if ((pGVar13->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar81 = 0;
                  auVar127 = ZEXT3264(local_6e0);
                  auVar173 = ZEXT3264(local_780);
                }
                else {
                  auVar127 = ZEXT3264(local_6e0);
                  if (context->args->filter == (RTCFilterFunctionN)0x0) {
                    auVar173 = ZEXT3264(local_780);
                    bVar81 = 1;
                    if (pGVar13->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_016f7308;
                  }
                  local_7a0 = ZEXT1632(CONCAT88(auVar21._8_8_,pGVar13));
                  local_5e0 = ZEXT1632(CONCAT124(auVar20._4_12_,(int)uVar87));
                  fVar129 = (float)local_280;
                  auVar142 = ZEXT3264(CONCAT428(fVar129,CONCAT424(fVar129,CONCAT420(fVar129,
                                                  CONCAT416(fVar129,CONCAT412(fVar129,CONCAT48(
                                                  fVar129,CONCAT44(fVar129,fVar129))))))));
                  local_200[0] = (fVar129 + (float)local_180._0_4_ + 0.0) * local_120;
                  local_200[1] = (fVar129 + (float)local_180._4_4_ + 1.0) * fStack_11c;
                  local_200[2] = (fVar129 + fStack_178 + 2.0) * fStack_118;
                  local_200[3] = (fVar129 + fStack_174 + 3.0) * fStack_114;
                  fStack_1f0 = (fVar129 + fStack_170 + 4.0) * fStack_110;
                  fStack_1ec = (fVar129 + fStack_16c + 5.0) * fStack_10c;
                  fStack_1e8 = (fVar129 + fStack_168 + 6.0) * fStack_108;
                  fStack_1e4 = fVar129 + fStack_164 + 7.0;
                  local_360._0_8_ = auVar19._0_8_;
                  local_360._8_8_ = auVar19._8_8_;
                  local_1e0 = local_360._0_8_;
                  uStack_1d8 = local_360._8_8_;
                  uStack_1d0 = 0;
                  uStack_1c8 = 0;
                  local_1c0 = local_1a0;
                  uVar82 = vmovmskps_avx(local_220);
                  local_5c0 = ZEXT1632(CONCAT124(auVar17._4_12_,
                                                 (int)CONCAT71((int7)((ulong)pGVar13 >> 8),
                                                               uVar82 != 0)));
                  if (uVar82 != 0) {
                    uVar84 = (ulong)(uVar82 & 0xff);
                    local_800 = ZEXT1632(CONCAT88(auVar148._8_8_,uVar84));
                    lVar26 = 0;
                    for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                      lVar26 = lVar26 + 1;
                    }
                    local_840 = ZEXT1632(CONCAT88(auVar16._8_8_,lVar26));
                    local_540._0_16_ = CONCAT88(uStack_4d8,local_4e0);
                    local_540 = ZEXT1632(local_540._0_16_);
                    _auStack_550 = auVar18._16_16_;
                    uStack_558 = uStack_4e8;
                    local_560 = (undefined1  [8])local_4f0;
                    _local_600 = CONCAT88(uStack_4f8,local_500);
                    _local_600 = ZEXT1632(_local_600);
                    _auStack_570 = auVar24._16_16_;
                    _local_580 = *local_638;
                    local_27c = iVar12;
                    do {
                      uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_3c0 = local_200[local_840._0_8_];
                      local_3b0 = *(undefined4 *)((long)&local_1e0 + local_840._0_8_ * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) =
                           *(undefined4 *)(local_1c0 + local_840._0_8_ * 4);
                      fVar106 = 1.0 - local_3c0;
                      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * fVar106)),
                                                ZEXT416((uint)(local_3c0 * fVar106)),
                                                ZEXT416(0xc0000000));
                      auVar16 = vfmsub132ss_fma(ZEXT416((uint)(local_3c0 * fVar106)),
                                                ZEXT416((uint)(local_3c0 * local_3c0)),
                                                ZEXT416(0x40000000));
                      fVar129 = auVar16._0_4_ * 3.0;
                      fVar104 = local_3c0 * local_3c0 * 3.0;
                      auVar159._0_4_ = fVar104 * (float)local_600._0_4_;
                      auVar159._4_4_ = fVar104 * (float)local_600._4_4_;
                      auVar159._8_4_ = fVar104 * (float)uStack_5f8;
                      auVar159._12_4_ = fVar104 * uStack_5f8._4_4_;
                      auVar134._4_4_ = fVar129;
                      auVar134._0_4_ = fVar129;
                      auVar134._8_4_ = fVar129;
                      auVar134._12_4_ = fVar129;
                      auVar16 = vfmadd132ps_fma(auVar134,auVar159,_local_560);
                      fVar129 = auVar17._0_4_ * 3.0;
                      auVar152._4_4_ = fVar129;
                      auVar152._0_4_ = fVar129;
                      auVar152._8_4_ = fVar129;
                      auVar152._12_4_ = fVar129;
                      auVar16 = vfmadd132ps_fma(auVar152,auVar16,local_540._0_16_);
                      fVar129 = fVar106 * fVar106 * -3.0;
                      local_630.context = context->user;
                      auVar135._4_4_ = fVar129;
                      auVar135._0_4_ = fVar129;
                      auVar135._8_4_ = fVar129;
                      auVar135._12_4_ = fVar129;
                      auVar77._8_8_ = uStack_6e8;
                      auVar77._0_8_ = local_6f0;
                      auVar16 = vfmadd132ps_fma(auVar135,auVar16,auVar77);
                      local_3f0 = auVar16._0_4_;
                      local_3e0 = vshufps_avx(auVar16,auVar16,0x55);
                      local_3d0 = vshufps_avx(auVar16,auVar16,0xaa);
                      auVar142 = ZEXT1664(local_3d0);
                      uStack_398 = CONCAT44(uStack_504,uStack_508);
                      local_3a0 = local_510;
                      local_390._4_4_ = uStack_30c;
                      local_390._0_4_ = local_310;
                      local_390._8_4_ = uStack_308;
                      local_390._12_4_ = uStack_304;
                      vpcmpeqd_avx2(ZEXT1632(local_390),ZEXT1632(local_390));
                      uStack_37c = (local_630.context)->instID[0];
                      local_380 = uStack_37c;
                      uStack_378 = uStack_37c;
                      uStack_374 = uStack_37c;
                      uStack_370 = (local_630.context)->instPrimID[0];
                      uStack_36c = uStack_370;
                      uStack_368 = uStack_370;
                      uStack_364 = uStack_370;
                      local_7c0 = local_580;
                      uStack_7b8 = uStack_578;
                      local_630.valid = (int *)&local_7c0;
                      local_630.geometryUserPtr = *(void **)(local_7a0._0_8_ + 0x18);
                      local_630.hit = (RTCHitN *)&local_3f0;
                      local_630.N = 4;
                      local_630.ray = (RTCRayN *)ray;
                      uStack_3ec = local_3f0;
                      uStack_3e8 = local_3f0;
                      uStack_3e4 = local_3f0;
                      fStack_3bc = local_3c0;
                      fStack_3b8 = local_3c0;
                      fStack_3b4 = local_3c0;
                      uStack_3ac = local_3b0;
                      uStack_3a8 = local_3b0;
                      uStack_3a4 = local_3b0;
                      if (*(code **)(local_7a0._0_8_ + 0x48) != (code *)0x0) {
                        auVar142 = ZEXT1664(local_3d0);
                        auVar206 = ZEXT1664(auVar206._0_16_);
                        (**(code **)(local_7a0._0_8_ + 0x48))(&local_630);
                      }
                      auVar74._8_8_ = uStack_7b8;
                      auVar74._0_8_ = local_7c0;
                      if (auVar74 == (undefined1  [16])0x0) {
                        auVar16 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar16 = auVar16 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar206 = ZEXT1664(auVar206._0_16_);
                          (*p_Var15)(&local_630);
                        }
                        auVar75._8_8_ = uStack_7b8;
                        auVar75._0_8_ = local_7c0;
                        auVar17 = vpcmpeqd_avx((undefined1  [16])0x0,auVar75);
                        auVar16 = auVar17 ^ _DAT_01febe20;
                        auVar136._8_4_ = 0xff800000;
                        auVar136._0_8_ = 0xff800000ff800000;
                        auVar136._12_4_ = 0xff800000;
                        auVar142 = ZEXT1664(auVar136);
                        auVar17 = vblendvps_avx(auVar136,*(undefined1 (*) [16])
                                                          (local_630.ray + 0x80),auVar17);
                        *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar17;
                      }
                      auVar117._8_8_ = 0x100000001;
                      auVar117._0_8_ = 0x100000001;
                      if ((auVar117 & auVar16) != (undefined1  [16])0x0) break;
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar90;
                      uVar87 = local_800._0_8_ ^ 1L << (local_840._0_8_ & 0x3f);
                      local_800._0_8_ = uVar87;
                      lVar26 = 0;
                      for (uVar84 = uVar87; (uVar84 & 1) == 0;
                          uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                        lVar26 = lVar26 + 1;
                      }
                      local_840._0_8_ = lVar26;
                      local_5c0._0_4_ = (int)CONCAT71((int7)((ulong)lVar26 >> 8),uVar87 != 0);
                    } while (uVar87 != 0);
                  }
                  bVar81 = local_5c0[0] & 1;
                  auVar173 = ZEXT3264(local_780);
                  auVar127 = ZEXT3264(local_6e0);
                  auVar182 = ZEXT3264(local_6c0);
                  auVar188 = ZEXT3264(local_680);
                  auVar177 = ZEXT3264(CONCAT428(fStack_644,
                                                CONCAT424(fStack_648,
                                                          CONCAT420(fStack_64c,
                                                                    CONCAT416(fStack_650,
                                                                              CONCAT412(fStack_654,
                                                                                        CONCAT48(
                                                  fStack_658,CONCAT44(fStack_65c,local_660))))))));
                  auVar212 = ZEXT3264(local_740);
                  auVar193 = ZEXT3264(local_760);
                  uVar87 = (ulong)(uint)local_5e0._0_4_;
                }
LAB_016f7308:
                uVar87 = CONCAT71((int7)(uVar87 >> 8),(byte)uVar87 | bVar81);
                fVar219 = (float)local_720;
                fVar221 = local_720._4_4_;
                fVar104 = (float)uStack_718;
                fVar106 = uStack_718._4_4_;
                fVar108 = (float)uStack_710;
                fVar146 = uStack_710._4_4_;
                fVar147 = (float)uStack_708;
                goto LAB_016f6dd6;
              }
            }
            auVar182 = ZEXT3264(local_6c0);
            auVar127 = ZEXT3264(local_6e0);
            auVar188 = ZEXT3264(local_680);
            auVar173 = ZEXT3264(local_780);
          }
LAB_016f6dd6:
          lVar88 = lVar88 + 8;
        } while ((int)lVar88 < iVar12);
      }
      if ((uVar87 & 1) != 0) {
        return local_84d;
      }
      uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar96._4_4_ = uVar90;
      auVar96._0_4_ = uVar90;
      auVar96._8_4_ = uVar90;
      auVar96._12_4_ = uVar90;
      auVar16 = vcmpps_avx(local_300,auVar96,2);
      uVar82 = vmovmskps_avx(auVar16);
      uVar82 = (uint)uVar89 & uVar82;
      local_84d = uVar82 != 0;
    } while (local_84d);
  }
  return local_84d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }